

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersector1<4>::
     occluded_n<embree::avx2::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  int iVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  bool bVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  uint uVar54;
  uint uVar55;
  ulong uVar56;
  long lVar58;
  byte bVar59;
  uint uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  undefined4 uVar64;
  float fVar65;
  vint4 bi_2;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  float fVar83;
  vint4 bi_1;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar88 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar101 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar113;
  float fVar126;
  vint4 ai_2;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  vint4 ai;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar161;
  float fVar163;
  vint4 bi;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar165;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar162;
  float fVar164;
  float fVar166;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar167;
  float fVar168;
  undefined1 auVar160 [32];
  undefined8 uVar169;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar184;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar185;
  undefined1 auVar183 [32];
  float fVar189;
  float fVar205;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  vint4 ai_1;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar210 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  float fVar222;
  float fVar232;
  vfloat4 a0_3;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  float fVar233;
  float fVar244;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  vfloat4 a0_1;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [32];
  vfloat4 a0;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  float fVar262;
  float fVar272;
  float fVar273;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar274;
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar278 [16];
  undefined1 auVar281 [64];
  undefined1 auVar282 [64];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar288 [32];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_539;
  undefined4 local_538;
  undefined1 local_4b8 [16];
  int local_49c;
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  float local_478;
  float fStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  float fStack_468;
  float fStack_464;
  float fStack_460;
  undefined4 uStack_45c;
  undefined1 local_458 [32];
  undefined1 local_438 [16];
  ulong local_420;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3e0;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  ulong local_338;
  Primitive *local_330;
  RTCFilterFunctionNArguments local_328;
  uint auStack_2f8 [4];
  undefined8 local_2e8;
  undefined4 local_2e0;
  undefined8 local_2dc;
  undefined4 local_2d4;
  undefined4 local_2d0;
  uint local_2cc;
  uint local_2c8;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [32];
  undefined1 local_1f8 [32];
  uint uStack_1d8;
  float afStack_1d4 [7];
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar57;
  undefined1 auVar123 [32];
  
  PVar4 = prim[1];
  uVar63 = (ulong)(byte)PVar4;
  fVar144 = *(float *)(prim + uVar63 * 0x19 + 0x12);
  auVar13 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar63 * 0x19 + 6));
  auVar146._0_4_ = fVar144 * (ray->dir).field_0.m128[0];
  auVar146._4_4_ = fVar144 * (ray->dir).field_0.m128[1];
  auVar146._8_4_ = fVar144 * (ray->dir).field_0.m128[2];
  auVar146._12_4_ = fVar144 * (ray->dir).field_0.m128[3];
  auVar66._0_4_ = fVar144 * auVar13._0_4_;
  auVar66._4_4_ = fVar144 * auVar13._4_4_;
  auVar66._8_4_ = fVar144 * auVar13._8_4_;
  auVar66._12_4_ = fVar144 * auVar13._12_4_;
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 4 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar277 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 6 + 6)));
  auVar277 = vcvtdq2ps_avx(auVar277);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xb + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar4 * 0xc + uVar63 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  uVar56 = (ulong)(uint)((int)(uVar63 * 9) * 2);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 + uVar63 + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  uVar56 = (ulong)(uint)((int)(uVar63 * 5) << 2);
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar275._4_4_ = auVar146._0_4_;
  auVar275._0_4_ = auVar146._0_4_;
  auVar275._8_4_ = auVar146._0_4_;
  auVar275._12_4_ = auVar146._0_4_;
  auVar84 = vshufps_avx(auVar146,auVar146,0x55);
  auVar67 = vshufps_avx(auVar146,auVar146,0xaa);
  fVar144 = auVar67._0_4_;
  auVar245._0_4_ = fVar144 * auVar277._0_4_;
  fVar162 = auVar67._4_4_;
  auVar245._4_4_ = fVar162 * auVar277._4_4_;
  fVar164 = auVar67._8_4_;
  auVar245._8_4_ = fVar164 * auVar277._8_4_;
  fVar166 = auVar67._12_4_;
  auVar245._12_4_ = fVar166 * auVar277._12_4_;
  auVar234._0_4_ = auVar12._0_4_ * fVar144;
  auVar234._4_4_ = auVar12._4_4_ * fVar162;
  auVar234._8_4_ = auVar12._8_4_ * fVar164;
  auVar234._12_4_ = auVar12._12_4_ * fVar166;
  auVar206._0_4_ = auVar98._0_4_ * fVar144;
  auVar206._4_4_ = auVar98._4_4_ * fVar162;
  auVar206._8_4_ = auVar98._8_4_ * fVar164;
  auVar206._12_4_ = auVar98._12_4_ * fVar166;
  auVar67 = vfmadd231ps_fma(auVar245,auVar84,auVar9);
  auVar213 = vfmadd231ps_fma(auVar234,auVar84,auVar11);
  auVar84 = vfmadd231ps_fma(auVar206,auVar68,auVar84);
  auVar114 = vfmadd231ps_fma(auVar67,auVar275,auVar13);
  auVar213 = vfmadd231ps_fma(auVar213,auVar275,auVar10);
  auVar128 = vfmadd231ps_fma(auVar84,auVar69,auVar275);
  auVar276._4_4_ = auVar66._0_4_;
  auVar276._0_4_ = auVar66._0_4_;
  auVar276._8_4_ = auVar66._0_4_;
  auVar276._12_4_ = auVar66._0_4_;
  auVar84 = vshufps_avx(auVar66,auVar66,0x55);
  auVar67 = vshufps_avx(auVar66,auVar66,0xaa);
  fVar144 = auVar67._0_4_;
  auVar147._0_4_ = fVar144 * auVar277._0_4_;
  fVar162 = auVar67._4_4_;
  auVar147._4_4_ = fVar162 * auVar277._4_4_;
  fVar164 = auVar67._8_4_;
  auVar147._8_4_ = fVar164 * auVar277._8_4_;
  fVar166 = auVar67._12_4_;
  auVar147._12_4_ = fVar166 * auVar277._12_4_;
  auVar133._0_4_ = auVar12._0_4_ * fVar144;
  auVar133._4_4_ = auVar12._4_4_ * fVar162;
  auVar133._8_4_ = auVar12._8_4_ * fVar164;
  auVar133._12_4_ = auVar12._12_4_ * fVar166;
  auVar67._0_4_ = auVar98._0_4_ * fVar144;
  auVar67._4_4_ = auVar98._4_4_ * fVar162;
  auVar67._8_4_ = auVar98._8_4_ * fVar164;
  auVar67._12_4_ = auVar98._12_4_ * fVar166;
  auVar9 = vfmadd231ps_fma(auVar147,auVar84,auVar9);
  auVar277 = vfmadd231ps_fma(auVar133,auVar84,auVar11);
  auVar11 = vfmadd231ps_fma(auVar67,auVar84,auVar68);
  auVar12 = vfmadd231ps_fma(auVar9,auVar276,auVar13);
  auVar68 = vfmadd231ps_fma(auVar277,auVar276,auVar10);
  auVar98 = vfmadd231ps_fma(auVar11,auVar276,auVar69);
  local_358._8_4_ = 0x7fffffff;
  local_358._0_8_ = 0x7fffffff7fffffff;
  local_358._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx(auVar114,local_358);
  auVar127._8_4_ = 0x219392ef;
  auVar127._0_8_ = 0x219392ef219392ef;
  auVar127._12_4_ = 0x219392ef;
  auVar13 = vcmpps_avx(auVar13,auVar127,1);
  auVar9 = vblendvps_avx(auVar114,auVar127,auVar13);
  auVar13 = vandps_avx(auVar213,local_358);
  auVar13 = vcmpps_avx(auVar13,auVar127,1);
  auVar277 = vblendvps_avx(auVar213,auVar127,auVar13);
  auVar13 = vandps_avx(auVar128,local_358);
  auVar13 = vcmpps_avx(auVar13,auVar127,1);
  auVar13 = vblendvps_avx(auVar128,auVar127,auVar13);
  auVar10 = vrcpps_avx(auVar9);
  auVar190._8_4_ = 0x3f800000;
  auVar190._0_8_ = &DAT_3f8000003f800000;
  auVar190._12_4_ = 0x3f800000;
  auVar9 = vfnmadd213ps_fma(auVar9,auVar10,auVar190);
  auVar10 = vfmadd132ps_fma(auVar9,auVar10,auVar10);
  auVar9 = vrcpps_avx(auVar277);
  auVar277 = vfnmadd213ps_fma(auVar277,auVar9,auVar190);
  auVar11 = vfmadd132ps_fma(auVar277,auVar9,auVar9);
  auVar9 = vrcpps_avx(auVar13);
  auVar277 = vfnmadd213ps_fma(auVar13,auVar9,auVar190);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar63 * 7 + 6);
  auVar13 = vpmovsxwd_avx(auVar13);
  auVar69 = vfmadd132ps_fma(auVar277,auVar9,auVar9);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar12);
  auVar128._0_4_ = auVar10._0_4_ * auVar13._0_4_;
  auVar128._4_4_ = auVar10._4_4_ * auVar13._4_4_;
  auVar128._8_4_ = auVar10._8_4_ * auVar13._8_4_;
  auVar128._12_4_ = auVar10._12_4_ * auVar13._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar63 * 9 + 6);
  auVar13 = vpmovsxwd_avx(auVar9);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar12);
  auVar148._0_4_ = auVar10._0_4_ * auVar13._0_4_;
  auVar148._4_4_ = auVar10._4_4_ * auVar13._4_4_;
  auVar148._8_4_ = auVar10._8_4_ * auVar13._8_4_;
  auVar148._12_4_ = auVar10._12_4_ * auVar13._12_4_;
  auVar213._1_3_ = 0;
  auVar213[0] = PVar4;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar277);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar63 * -2 + 6);
  auVar13 = vpmovsxwd_avx(auVar10);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar68);
  auVar207._0_4_ = auVar13._0_4_ * auVar11._0_4_;
  auVar207._4_4_ = auVar13._4_4_ * auVar11._4_4_;
  auVar207._8_4_ = auVar13._8_4_ * auVar11._8_4_;
  auVar207._12_4_ = auVar13._12_4_ * auVar11._12_4_;
  auVar13 = vcvtdq2ps_avx(auVar9);
  auVar13 = vsubps_avx(auVar13,auVar68);
  auVar84._0_4_ = auVar11._0_4_ * auVar13._0_4_;
  auVar84._4_4_ = auVar11._4_4_ * auVar13._4_4_;
  auVar84._8_4_ = auVar11._8_4_ * auVar13._8_4_;
  auVar84._12_4_ = auVar11._12_4_ * auVar13._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar56 + uVar63 + 6);
  auVar13 = vpmovsxwd_avx(auVar11);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar98);
  auVar114._0_4_ = auVar69._0_4_ * auVar13._0_4_;
  auVar114._4_4_ = auVar69._4_4_ * auVar13._4_4_;
  auVar114._8_4_ = auVar69._8_4_ * auVar13._8_4_;
  auVar114._12_4_ = auVar69._12_4_ * auVar13._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar63 * 0x17 + 6);
  auVar13 = vpmovsxwd_avx(auVar12);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar98);
  auVar68._0_4_ = auVar69._0_4_ * auVar13._0_4_;
  auVar68._4_4_ = auVar69._4_4_ * auVar13._4_4_;
  auVar68._8_4_ = auVar69._8_4_ * auVar13._8_4_;
  auVar68._12_4_ = auVar69._12_4_ * auVar13._12_4_;
  auVar13 = vpminsd_avx(auVar128,auVar148);
  auVar9 = vpminsd_avx(auVar207,auVar84);
  auVar13 = vmaxps_avx(auVar13,auVar9);
  auVar9 = vpminsd_avx(auVar114,auVar68);
  uVar64 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar223._4_4_ = uVar64;
  auVar223._0_4_ = uVar64;
  auVar223._8_4_ = uVar64;
  auVar223._12_4_ = uVar64;
  auVar9 = vmaxps_avx(auVar9,auVar223);
  auVar13 = vmaxps_avx(auVar13,auVar9);
  local_278._0_4_ = auVar13._0_4_ * 0.99999964;
  local_278._4_4_ = auVar13._4_4_ * 0.99999964;
  local_278._8_4_ = auVar13._8_4_ * 0.99999964;
  local_278._12_4_ = auVar13._12_4_ * 0.99999964;
  auVar13 = vpmaxsd_avx(auVar128,auVar148);
  auVar9 = vpmaxsd_avx(auVar207,auVar84);
  auVar13 = vminps_avx(auVar13,auVar9);
  auVar9 = vpmaxsd_avx(auVar114,auVar68);
  fVar144 = ray->tfar;
  auVar98._4_4_ = fVar144;
  auVar98._0_4_ = fVar144;
  auVar98._8_4_ = fVar144;
  auVar98._12_4_ = fVar144;
  auVar9 = vminps_avx(auVar9,auVar98);
  auVar13 = vminps_avx(auVar13,auVar9);
  auVar69._0_4_ = auVar13._0_4_ * 1.0000004;
  auVar69._4_4_ = auVar13._4_4_ * 1.0000004;
  auVar69._8_4_ = auVar13._8_4_ * 1.0000004;
  auVar69._12_4_ = auVar13._12_4_ * 1.0000004;
  auVar213[4] = PVar4;
  auVar213._5_3_ = 0;
  auVar213[8] = PVar4;
  auVar213._9_3_ = 0;
  auVar213[0xc] = PVar4;
  auVar213._13_3_ = 0;
  auVar9 = vpcmpgtd_avx(auVar213,_DAT_01ff0cf0);
  auVar13 = vcmpps_avx(local_278,auVar69,2);
  auVar13 = vandps_avx(auVar13,auVar9);
  uVar54 = vmovmskps_avx(auVar13);
  local_539 = uVar54 != 0;
  if (uVar54 == 0) {
    return local_539;
  }
  uVar54 = uVar54 & 0xff;
  auVar82._16_16_ = mm_lookupmask_ps._240_16_;
  auVar82._0_16_ = mm_lookupmask_ps._240_16_;
  local_1f8 = vblendps_avx(auVar82,ZEXT832(0) << 0x20,0x80);
  local_330 = prim;
LAB_016d35fb:
  lVar58 = 0;
  uVar63 = (ulong)uVar54;
  for (uVar56 = uVar63; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
    lVar58 = lVar58 + 1;
  }
  local_420 = (ulong)*(uint *)(local_330 + 2);
  local_338 = (ulong)*(uint *)(local_330 + lVar58 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[local_420].ptr;
  uVar56 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_338);
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar13 = *(undefined1 (*) [16])(_Var8 + uVar56 * (long)pvVar7);
  auVar9 = *(undefined1 (*) [16])(_Var8 + (uVar56 + 1) * (long)pvVar7);
  auVar277 = *(undefined1 (*) [16])(_Var8 + (uVar56 + 2) * (long)pvVar7);
  pfVar1 = (float *)(_Var8 + (long)pvVar7 * (uVar56 + 3));
  fVar144 = *pfVar1;
  fVar162 = pfVar1[1];
  fVar164 = pfVar1[2];
  fVar166 = pfVar1[3];
  lVar58 = *(long *)&pGVar5[1].time_range.upper;
  auVar10 = *(undefined1 (*) [16])(lVar58 + (long)p_Var6 * uVar56);
  auVar11 = *(undefined1 (*) [16])(lVar58 + (long)p_Var6 * (uVar56 + 1));
  auVar12 = *(undefined1 (*) [16])(lVar58 + (long)p_Var6 * (uVar56 + 2));
  uVar63 = uVar63 - 1 & uVar63;
  pfVar1 = (float *)(lVar58 + (long)p_Var6 * (uVar56 + 3));
  fVar83 = *pfVar1;
  fVar65 = pfVar1[1];
  fVar145 = pfVar1[2];
  fVar184 = pfVar1[3];
  if (uVar63 != 0) {
    uVar62 = uVar63 - 1 & uVar63;
    for (uVar56 = uVar63; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
    }
    if (uVar62 != 0) {
      for (; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar85._8_4_ = 0x80000000;
  auVar85._0_8_ = 0x8000000080000000;
  auVar85._12_4_ = 0x80000000;
  auVar99._0_4_ = fVar83 * -0.0;
  auVar99._4_4_ = fVar65 * -0.0;
  auVar99._8_4_ = fVar145 * -0.0;
  auVar99._12_4_ = fVar184 * -0.0;
  auVar69 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar12,auVar99);
  auVar70._0_4_ = auVar11._0_4_ + auVar69._0_4_;
  auVar70._4_4_ = auVar11._4_4_ + auVar69._4_4_;
  auVar70._8_4_ = auVar11._8_4_ + auVar69._8_4_;
  auVar70._12_4_ = auVar11._12_4_ + auVar69._12_4_;
  auVar68 = vfmadd231ps_fma(auVar70,auVar10,auVar85);
  auVar114 = ZEXT816(0) << 0x40;
  auVar86._0_4_ = fVar83 * 0.0;
  auVar86._4_4_ = fVar65 * 0.0;
  auVar86._8_4_ = fVar145 * 0.0;
  auVar86._12_4_ = fVar184 * 0.0;
  auVar283._8_4_ = 0x3f000000;
  auVar283._0_8_ = 0x3f0000003f000000;
  auVar283._12_4_ = 0x3f000000;
  auVar69 = vfmadd231ps_fma(auVar86,auVar12,auVar283);
  auVar69 = vfmadd231ps_fma(auVar69,auVar11,auVar114);
  auVar67 = vfnmadd231ps_fma(auVar69,auVar10,auVar283);
  auVar263._0_4_ = fVar144 * -0.0;
  auVar263._4_4_ = fVar162 * -0.0;
  auVar263._8_4_ = fVar164 * -0.0;
  auVar263._12_4_ = fVar166 * -0.0;
  auVar69 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar277,auVar263);
  auVar255._0_4_ = auVar69._0_4_ + auVar9._0_4_;
  auVar255._4_4_ = auVar69._4_4_ + auVar9._4_4_;
  auVar255._8_4_ = auVar69._8_4_ + auVar9._8_4_;
  auVar255._12_4_ = auVar69._12_4_ + auVar9._12_4_;
  auVar69 = vfmadd231ps_fma(auVar255,auVar13,auVar85);
  auVar246._0_4_ = fVar144 * 0.0;
  auVar246._4_4_ = fVar162 * 0.0;
  auVar246._8_4_ = fVar164 * 0.0;
  auVar246._12_4_ = fVar166 * 0.0;
  auVar98 = vfmadd231ps_fma(auVar246,auVar277,auVar283);
  auVar98 = vfmadd231ps_fma(auVar98,auVar9,auVar114);
  auVar213 = vfnmadd231ps_fma(auVar98,auVar13,auVar283);
  auVar100._0_4_ = auVar12._0_4_ + auVar99._0_4_;
  auVar100._4_4_ = auVar12._4_4_ + auVar99._4_4_;
  auVar100._8_4_ = auVar12._8_4_ + auVar99._8_4_;
  auVar100._12_4_ = auVar12._12_4_ + auVar99._12_4_;
  auVar98 = vfmadd231ps_fma(auVar100,auVar11,auVar114);
  auVar98 = vfmadd231ps_fma(auVar98,auVar10,auVar85);
  auVar115._0_4_ = fVar83 * 0.5;
  auVar115._4_4_ = fVar65 * 0.5;
  auVar115._8_4_ = fVar145 * 0.5;
  auVar115._12_4_ = fVar184 * 0.5;
  auVar12 = vfmadd231ps_fma(auVar115,auVar114,auVar12);
  auVar11 = vfnmadd231ps_fma(auVar12,auVar283,auVar11);
  auVar84 = vfmadd231ps_fma(auVar11,auVar114,auVar10);
  auVar208._0_4_ = auVar263._0_4_ + auVar277._0_4_;
  auVar208._4_4_ = auVar263._4_4_ + auVar277._4_4_;
  auVar208._8_4_ = auVar263._8_4_ + auVar277._8_4_;
  auVar208._12_4_ = auVar263._12_4_ + auVar277._12_4_;
  auVar10 = vfmadd231ps_fma(auVar208,auVar9,auVar114);
  auVar11 = vfmadd231ps_fma(auVar10,auVar13,auVar85);
  auVar224._0_4_ = fVar144 * 0.5;
  auVar224._4_4_ = fVar162 * 0.5;
  auVar224._8_4_ = fVar164 * 0.5;
  auVar224._12_4_ = fVar166 * 0.5;
  auVar277 = vfmadd231ps_fma(auVar224,auVar114,auVar277);
  auVar9 = vfnmadd231ps_fma(auVar277,auVar283,auVar9);
  auVar12 = vfmadd231ps_fma(auVar9,auVar114,auVar13);
  auVar13 = vshufps_avx(auVar67,auVar67,0xc9);
  auVar9 = vshufps_avx(auVar69,auVar69,0xc9);
  fVar83 = auVar67._0_4_;
  auVar149._0_4_ = fVar83 * auVar9._0_4_;
  fVar65 = auVar67._4_4_;
  auVar149._4_4_ = fVar65 * auVar9._4_4_;
  fVar145 = auVar67._8_4_;
  auVar149._8_4_ = fVar145 * auVar9._8_4_;
  fVar184 = auVar67._12_4_;
  auVar149._12_4_ = fVar184 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar149,auVar13,auVar69);
  auVar277 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar213,auVar213,0xc9);
  auVar150._0_4_ = fVar83 * auVar9._0_4_;
  auVar150._4_4_ = fVar65 * auVar9._4_4_;
  auVar150._8_4_ = fVar145 * auVar9._8_4_;
  auVar150._12_4_ = fVar184 * auVar9._12_4_;
  auVar13 = vfmsub231ps_fma(auVar150,auVar13,auVar213);
  auVar10 = vshufps_avx(auVar13,auVar13,0xc9);
  auVar13 = vshufps_avx(auVar84,auVar84,0xc9);
  auVar9 = vshufps_avx(auVar11,auVar11,0xc9);
  fVar113 = auVar84._0_4_;
  auVar129._0_4_ = fVar113 * auVar9._0_4_;
  fVar126 = auVar84._4_4_;
  auVar129._4_4_ = fVar126 * auVar9._4_4_;
  fVar167 = auVar84._8_4_;
  auVar129._8_4_ = fVar167 * auVar9._8_4_;
  fVar168 = auVar84._12_4_;
  auVar129._12_4_ = fVar168 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar129,auVar13,auVar11);
  auVar11 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar170._0_4_ = fVar113 * auVar9._0_4_;
  auVar170._4_4_ = fVar126 * auVar9._4_4_;
  auVar170._8_4_ = fVar167 * auVar9._8_4_;
  auVar170._12_4_ = fVar168 * auVar9._12_4_;
  auVar13 = vfmsub231ps_fma(auVar170,auVar13,auVar12);
  auVar12 = vshufps_avx(auVar13,auVar13,0xc9);
  auVar13 = vdpps_avx(auVar277,auVar277,0x7f);
  fVar162 = auVar13._0_4_;
  auVar225._4_12_ = ZEXT812(0) << 0x20;
  auVar225._0_4_ = fVar162;
  auVar9 = vrsqrtss_avx(auVar225,auVar225);
  fVar144 = auVar9._0_4_;
  fVar144 = fVar144 * 1.5 + fVar162 * -0.5 * fVar144 * fVar144 * fVar144;
  auVar9 = vdpps_avx(auVar277,auVar10,0x7f);
  fVar143 = fVar144 * auVar277._0_4_;
  fVar161 = fVar144 * auVar277._4_4_;
  fVar163 = fVar144 * auVar277._8_4_;
  fVar165 = fVar144 * auVar277._12_4_;
  auVar235._0_4_ = auVar10._0_4_ * fVar162;
  auVar235._4_4_ = auVar10._4_4_ * fVar162;
  auVar235._8_4_ = auVar10._8_4_ * fVar162;
  auVar235._12_4_ = auVar10._12_4_ * fVar162;
  fVar162 = auVar9._0_4_;
  auVar191._0_4_ = fVar162 * auVar277._0_4_;
  auVar191._4_4_ = fVar162 * auVar277._4_4_;
  auVar191._8_4_ = fVar162 * auVar277._8_4_;
  auVar191._12_4_ = fVar162 * auVar277._12_4_;
  auVar277 = vsubps_avx(auVar235,auVar191);
  auVar9 = vrcpss_avx(auVar225,auVar225);
  auVar13 = vfnmadd213ss_fma(auVar13,auVar9,SUB6416(ZEXT464(0x40000000),0));
  fVar164 = auVar9._0_4_ * auVar13._0_4_;
  auVar13 = vdpps_avx(auVar11,auVar11,0x7f);
  fVar166 = auVar13._0_4_;
  auVar226._4_12_ = ZEXT812(0) << 0x20;
  auVar226._0_4_ = fVar166;
  auVar9 = vrsqrtss_avx(auVar226,auVar226);
  fVar162 = auVar9._0_4_;
  auVar9 = vdpps_avx(auVar11,auVar12,0x7f);
  fVar162 = fVar162 * 1.5 + fVar166 * -0.5 * fVar162 * fVar162 * fVar162;
  fVar262 = fVar162 * auVar11._0_4_;
  fVar272 = fVar162 * auVar11._4_4_;
  fVar273 = fVar162 * auVar11._8_4_;
  fVar274 = fVar162 * auVar11._12_4_;
  auVar171._0_4_ = fVar166 * auVar12._0_4_;
  auVar171._4_4_ = fVar166 * auVar12._4_4_;
  auVar171._8_4_ = fVar166 * auVar12._8_4_;
  auVar171._12_4_ = fVar166 * auVar12._12_4_;
  fVar166 = auVar9._0_4_;
  auVar130._0_4_ = fVar166 * auVar11._0_4_;
  auVar130._4_4_ = fVar166 * auVar11._4_4_;
  auVar130._8_4_ = fVar166 * auVar11._8_4_;
  auVar130._12_4_ = fVar166 * auVar11._12_4_;
  auVar10 = vsubps_avx(auVar171,auVar130);
  auVar9 = vrcpss_avx(auVar226,auVar226);
  auVar13 = vfnmadd213ss_fma(auVar13,auVar9,SUB6416(ZEXT464(0x40000000),0));
  fVar166 = auVar13._0_4_ * auVar9._0_4_;
  auVar13 = vshufps_avx(auVar68,auVar68,0xff);
  auVar209._0_4_ = auVar13._0_4_ * fVar143;
  auVar209._4_4_ = auVar13._4_4_ * fVar161;
  auVar209._8_4_ = auVar13._8_4_ * fVar163;
  auVar209._12_4_ = auVar13._12_4_ * fVar165;
  local_368 = vsubps_avx(auVar68,auVar209);
  auVar9 = vshufps_avx(auVar67,auVar67,0xff);
  auVar151._0_4_ = auVar9._0_4_ * fVar143 + auVar13._0_4_ * fVar144 * fVar164 * auVar277._0_4_;
  auVar151._4_4_ = auVar9._4_4_ * fVar161 + auVar13._4_4_ * fVar144 * fVar164 * auVar277._4_4_;
  auVar151._8_4_ = auVar9._8_4_ * fVar163 + auVar13._8_4_ * fVar144 * fVar164 * auVar277._8_4_;
  auVar151._12_4_ = auVar9._12_4_ * fVar165 + auVar13._12_4_ * fVar144 * fVar164 * auVar277._12_4_;
  auVar277 = vsubps_avx(auVar67,auVar151);
  local_378._0_4_ = auVar209._0_4_ + auVar68._0_4_;
  local_378._4_4_ = auVar209._4_4_ + auVar68._4_4_;
  fStack_370 = auVar209._8_4_ + auVar68._8_4_;
  fStack_36c = auVar209._12_4_ + auVar68._12_4_;
  auVar13 = vshufps_avx(auVar98,auVar98,0xff);
  auVar87._0_4_ = fVar262 * auVar13._0_4_;
  auVar87._4_4_ = fVar272 * auVar13._4_4_;
  auVar87._8_4_ = fVar273 * auVar13._8_4_;
  auVar87._12_4_ = fVar274 * auVar13._12_4_;
  local_388 = vsubps_avx(auVar98,auVar87);
  auVar9 = vshufps_avx(auVar84,auVar84,0xff);
  auVar71._0_4_ = fVar262 * auVar9._0_4_ + auVar13._0_4_ * fVar162 * auVar10._0_4_ * fVar166;
  auVar71._4_4_ = fVar272 * auVar9._4_4_ + auVar13._4_4_ * fVar162 * auVar10._4_4_ * fVar166;
  auVar71._8_4_ = fVar273 * auVar9._8_4_ + auVar13._8_4_ * fVar162 * auVar10._8_4_ * fVar166;
  auVar71._12_4_ = fVar274 * auVar9._12_4_ + auVar13._12_4_ * fVar162 * auVar10._12_4_ * fVar166;
  auVar13 = vsubps_avx(auVar84,auVar71);
  local_3d8 = auVar98._0_4_ + auVar87._0_4_;
  fStack_3d4 = auVar98._4_4_ + auVar87._4_4_;
  fStack_3d0 = auVar98._8_4_ + auVar87._8_4_;
  fStack_3cc = auVar98._12_4_ + auVar87._12_4_;
  local_398._0_4_ = local_368._0_4_ + auVar277._0_4_ * 0.33333334;
  local_398._4_4_ = local_368._4_4_ + auVar277._4_4_ * 0.33333334;
  local_398._8_4_ = local_368._8_4_ + auVar277._8_4_ * 0.33333334;
  local_398._12_4_ = local_368._12_4_ + auVar277._12_4_ * 0.33333334;
  auVar72._0_4_ = auVar13._0_4_ * 0.33333334;
  auVar72._4_4_ = auVar13._4_4_ * 0.33333334;
  auVar72._8_4_ = auVar13._8_4_ * 0.33333334;
  auVar72._12_4_ = auVar13._12_4_ * 0.33333334;
  local_3a8 = vsubps_avx(local_388,auVar72);
  aVar2 = (ray->org).field_0;
  auVar277 = vsubps_avx(local_368,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar277,auVar277,0x55);
  auVar9 = vshufps_avx(auVar277,auVar277,0xaa);
  aVar3 = (pre->ray_space).vy.field_0;
  fVar144 = (pre->ray_space).vz.field_0.m128[0];
  fVar162 = (pre->ray_space).vz.field_0.m128[1];
  fVar164 = (pre->ray_space).vz.field_0.m128[2];
  fVar166 = (pre->ray_space).vz.field_0.m128[3];
  auVar73._0_4_ = fVar144 * auVar9._0_4_;
  auVar73._4_4_ = fVar162 * auVar9._4_4_;
  auVar73._8_4_ = fVar164 * auVar9._8_4_;
  auVar73._12_4_ = fVar166 * auVar9._12_4_;
  auVar84 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar3,auVar13);
  auVar10 = vsubps_avx(local_398,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar10,auVar10,0x55);
  auVar9 = vshufps_avx(auVar10,auVar10,0xaa);
  auVar74._0_4_ = fVar144 * auVar9._0_4_;
  auVar74._4_4_ = fVar162 * auVar9._4_4_;
  auVar74._8_4_ = fVar164 * auVar9._8_4_;
  auVar74._12_4_ = fVar166 * auVar9._12_4_;
  auVar67 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar3,auVar13);
  auVar9 = vsubps_avx(local_3a8,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar9,auVar9,0xaa);
  auVar75._0_4_ = fVar144 * auVar13._0_4_;
  auVar75._4_4_ = fVar162 * auVar13._4_4_;
  auVar75._8_4_ = fVar164 * auVar13._8_4_;
  auVar75._12_4_ = fVar166 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar9,auVar9,0x55);
  auVar213 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar3,auVar13);
  auVar11 = vsubps_avx(local_388,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar11,auVar11,0xaa);
  auVar76._0_4_ = fVar144 * auVar13._0_4_;
  auVar76._4_4_ = fVar162 * auVar13._4_4_;
  auVar76._8_4_ = fVar164 * auVar13._8_4_;
  auVar76._12_4_ = fVar166 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar11,auVar11,0x55);
  auVar114 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar3,auVar13);
  auVar12 = vsubps_avx(_local_378,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar12,auVar12,0xaa);
  auVar152._0_4_ = fVar144 * auVar13._0_4_;
  auVar152._4_4_ = fVar162 * auVar13._4_4_;
  auVar152._8_4_ = fVar164 * auVar13._8_4_;
  auVar152._12_4_ = fVar166 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar12,auVar12,0x55);
  auVar128 = vfmadd231ps_fma(auVar152,(undefined1  [16])aVar3,auVar13);
  local_3b8._0_4_ = (fVar83 + auVar151._0_4_) * 0.33333334 + (float)local_378._0_4_;
  local_3b8._4_4_ = (fVar65 + auVar151._4_4_) * 0.33333334 + (float)local_378._4_4_;
  fStack_3b0 = (fVar145 + auVar151._8_4_) * 0.33333334 + fStack_370;
  fStack_3ac = (fVar184 + auVar151._12_4_) * 0.33333334 + fStack_36c;
  auVar69 = vsubps_avx(_local_3b8,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar69,auVar69,0xaa);
  auVar247._0_4_ = fVar144 * auVar13._0_4_;
  auVar247._4_4_ = fVar162 * auVar13._4_4_;
  auVar247._8_4_ = fVar164 * auVar13._8_4_;
  auVar247._12_4_ = fVar166 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar69,auVar69,0x55);
  auVar66 = vfmadd231ps_fma(auVar247,(undefined1  [16])aVar3,auVar13);
  auVar236._0_4_ = (fVar113 + auVar71._0_4_) * 0.33333334;
  auVar236._4_4_ = (fVar126 + auVar71._4_4_) * 0.33333334;
  auVar236._8_4_ = (fVar167 + auVar71._8_4_) * 0.33333334;
  auVar236._12_4_ = (fVar168 + auVar71._12_4_) * 0.33333334;
  auVar48._4_4_ = fStack_3d4;
  auVar48._0_4_ = local_3d8;
  auVar48._8_4_ = fStack_3d0;
  auVar48._12_4_ = fStack_3cc;
  _local_3c8 = vsubps_avx(auVar48,auVar236);
  auVar68 = vsubps_avx(_local_3c8,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar68,auVar68,0xaa);
  auVar237._0_4_ = fVar144 * auVar13._0_4_;
  auVar237._4_4_ = fVar162 * auVar13._4_4_;
  auVar237._8_4_ = fVar164 * auVar13._8_4_;
  auVar237._12_4_ = fVar166 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar68,auVar68,0x55);
  auVar133 = vfmadd231ps_fma(auVar237,(undefined1  [16])aVar3,auVar13);
  auVar98 = vsubps_avx(auVar48,(undefined1  [16])aVar2);
  auVar13 = vshufps_avx(auVar98,auVar98,0xaa);
  auVar192._0_4_ = fVar144 * auVar13._0_4_;
  auVar192._4_4_ = fVar162 * auVar13._4_4_;
  auVar192._8_4_ = fVar164 * auVar13._8_4_;
  auVar192._12_4_ = fVar166 * auVar13._12_4_;
  auVar13 = vshufps_avx(auVar98,auVar98,0x55);
  auVar13 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar3,auVar13);
  local_438._0_4_ = auVar277._0_4_;
  auVar172._4_4_ = local_438._0_4_;
  auVar172._0_4_ = local_438._0_4_;
  auVar172._8_4_ = local_438._0_4_;
  auVar172._12_4_ = local_438._0_4_;
  aVar3 = (pre->ray_space).vx.field_0;
  auVar84 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar3,auVar172);
  local_538 = auVar10._0_4_;
  auVar173._4_4_ = local_538;
  auVar173._0_4_ = local_538;
  auVar173._8_4_ = local_538;
  auVar173._12_4_ = local_538;
  auVar10 = vfmadd231ps_fma(auVar67,(undefined1  [16])aVar3,auVar173);
  uVar64 = auVar9._0_4_;
  auVar174._4_4_ = uVar64;
  auVar174._0_4_ = uVar64;
  auVar174._8_4_ = uVar64;
  auVar174._12_4_ = uVar64;
  auVar67 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar3,auVar174);
  uVar64 = auVar11._0_4_;
  auVar175._4_4_ = uVar64;
  auVar175._0_4_ = uVar64;
  auVar175._8_4_ = uVar64;
  auVar175._12_4_ = uVar64;
  auVar11 = vfmadd231ps_fma(auVar114,(undefined1  [16])aVar3,auVar175);
  uVar64 = auVar12._0_4_;
  auVar176._4_4_ = uVar64;
  auVar176._0_4_ = uVar64;
  auVar176._8_4_ = uVar64;
  auVar176._12_4_ = uVar64;
  auVar12 = vfmadd231ps_fma(auVar128,(undefined1  [16])aVar3,auVar176);
  uVar64 = auVar69._0_4_;
  auVar177._4_4_ = uVar64;
  auVar177._0_4_ = uVar64;
  auVar177._8_4_ = uVar64;
  auVar177._12_4_ = uVar64;
  auVar69 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar3,auVar177);
  uVar64 = auVar68._0_4_;
  auVar77._4_4_ = uVar64;
  auVar77._0_4_ = uVar64;
  auVar77._8_4_ = uVar64;
  auVar77._12_4_ = uVar64;
  auVar68 = vfmadd231ps_fma(auVar133,(undefined1  [16])aVar3,auVar77);
  uVar64 = auVar98._0_4_;
  auVar78._4_4_ = uVar64;
  auVar78._0_4_ = uVar64;
  auVar78._8_4_ = uVar64;
  auVar78._12_4_ = uVar64;
  auVar98 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar3,auVar78);
  local_488 = vmovlhps_avx(auVar84,auVar12);
  local_498 = vmovlhps_avx(auVar10,auVar69);
  local_348 = vmovlhps_avx(auVar67,auVar68);
  _local_258 = vmovlhps_avx(auVar11,auVar98);
  auVar281 = ZEXT1664(_local_258);
  auVar13 = vminps_avx(local_488,local_498);
  auVar9 = vminps_avx(local_348,_local_258);
  auVar277 = vminps_avx(auVar13,auVar9);
  auVar13 = vmaxps_avx(local_488,local_498);
  auVar9 = vmaxps_avx(local_348,_local_258);
  auVar13 = vmaxps_avx(auVar13,auVar9);
  auVar9 = vshufpd_avx(auVar277,auVar277,3);
  auVar277 = vminps_avx(auVar277,auVar9);
  auVar9 = vshufpd_avx(auVar13,auVar13,3);
  auVar9 = vmaxps_avx(auVar13,auVar9);
  auVar13 = vandps_avx(local_358,auVar277);
  auVar9 = vandps_avx(local_358,auVar9);
  auVar13 = vmaxps_avx(auVar13,auVar9);
  auVar9 = vmovshdup_avx(auVar13);
  auVar13 = vmaxss_avx(auVar9,auVar13);
  local_198 = auVar13._0_4_ * 9.536743e-07;
  auVar284._8_8_ = auVar84._0_8_;
  auVar284._0_8_ = auVar84._0_8_;
  auVar210._8_8_ = auVar10._0_8_;
  auVar210._0_8_ = auVar10._0_8_;
  auVar88._8_8_ = auVar67._0_8_;
  auVar88._0_8_ = auVar67._0_8_;
  auVar101._8_8_ = auVar11._0_8_;
  auVar101._0_8_ = auVar11._0_8_;
  local_438 = ZEXT416((uint)local_198);
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_188 = local_198;
  fStack_184 = local_198;
  fStack_180 = local_198;
  fStack_17c = local_198;
  fStack_1b0 = -local_198;
  local_1b8 = -local_198;
  fStack_1b4 = -local_198;
  fStack_1ac = fStack_1b0;
  fStack_1a8 = fStack_1b0;
  fStack_1a4 = fStack_1b0;
  fStack_1a0 = fStack_1b0;
  fStack_19c = fStack_1b0;
  uVar62 = 0;
  uVar56 = 0;
  local_228 = vsubps_avx(local_498,local_488);
  local_238 = vsubps_avx(local_348,local_498);
  local_248 = vsubps_avx(_local_258,local_348);
  local_288 = vsubps_avx(_local_378,local_368);
  local_298 = vsubps_avx(_local_3b8,local_398);
  local_2a8 = vsubps_avx(_local_3c8,local_3a8);
  auVar49._4_4_ = fStack_3d4;
  auVar49._0_4_ = local_3d8;
  auVar49._8_4_ = fStack_3d0;
  auVar49._12_4_ = fStack_3cc;
  _local_2b8 = vsubps_avx(auVar49,local_388);
  local_4b8 = ZEXT816(0x3f80000000000000);
  local_268 = local_4b8;
  do {
    auVar13 = vshufps_avx(local_4b8,local_4b8,0x50);
    auVar116._8_4_ = 0x3f800000;
    auVar116._0_8_ = &DAT_3f8000003f800000;
    auVar116._12_4_ = 0x3f800000;
    auVar123._16_4_ = 0x3f800000;
    auVar123._0_16_ = auVar116;
    auVar123._20_4_ = 0x3f800000;
    auVar123._24_4_ = 0x3f800000;
    auVar123._28_4_ = 0x3f800000;
    auVar9 = vsubps_avx(auVar116,auVar13);
    fVar144 = auVar13._0_4_;
    fVar113 = auVar12._0_4_;
    auVar79._0_4_ = fVar113 * fVar144;
    fVar162 = auVar13._4_4_;
    fVar126 = auVar12._4_4_;
    auVar79._4_4_ = fVar126 * fVar162;
    fVar164 = auVar13._8_4_;
    auVar79._8_4_ = fVar113 * fVar164;
    fVar166 = auVar13._12_4_;
    auVar79._12_4_ = fVar126 * fVar166;
    fVar189 = auVar69._0_4_;
    auVar153._0_4_ = fVar189 * fVar144;
    fVar205 = auVar69._4_4_;
    auVar153._4_4_ = fVar205 * fVar162;
    auVar153._8_4_ = fVar189 * fVar164;
    auVar153._12_4_ = fVar205 * fVar166;
    fVar233 = auVar68._0_4_;
    auVar193._0_4_ = fVar233 * fVar144;
    fVar244 = auVar68._4_4_;
    auVar193._4_4_ = fVar244 * fVar162;
    auVar193._8_4_ = fVar233 * fVar164;
    auVar193._12_4_ = fVar244 * fVar166;
    fVar222 = auVar98._0_4_;
    auVar238._0_4_ = fVar222 * fVar144;
    fVar232 = auVar98._4_4_;
    auVar238._4_4_ = fVar232 * fVar162;
    auVar238._8_4_ = fVar222 * fVar164;
    auVar238._12_4_ = fVar232 * fVar166;
    auVar11 = vfmadd231ps_fma(auVar79,auVar9,auVar284);
    auVar84 = vfmadd231ps_fma(auVar153,auVar9,auVar210);
    auVar67 = vfmadd231ps_fma(auVar193,auVar9,auVar88);
    auVar213 = vfmadd231ps_fma(auVar238,auVar101,auVar9);
    auVar13 = vmovshdup_avx(local_268);
    fVar144 = local_268._0_4_;
    fVar83 = (auVar13._0_4_ - fVar144) * 0.04761905;
    auVar221._4_4_ = fVar144;
    auVar221._0_4_ = fVar144;
    auVar221._8_4_ = fVar144;
    auVar221._12_4_ = fVar144;
    auVar221._16_4_ = fVar144;
    auVar221._20_4_ = fVar144;
    auVar221._24_4_ = fVar144;
    auVar221._28_4_ = fVar144;
    auVar110._0_8_ = auVar13._0_8_;
    auVar110._8_8_ = auVar110._0_8_;
    auVar110._16_8_ = auVar110._0_8_;
    auVar110._24_8_ = auVar110._0_8_;
    auVar82 = vsubps_avx(auVar110,auVar221);
    uVar64 = auVar11._0_4_;
    auVar288._4_4_ = uVar64;
    auVar288._0_4_ = uVar64;
    auVar288._8_4_ = uVar64;
    auVar288._12_4_ = uVar64;
    auVar288._16_4_ = uVar64;
    auVar288._20_4_ = uVar64;
    auVar288._24_4_ = uVar64;
    auVar288._28_4_ = uVar64;
    auVar13 = vmovshdup_avx(auVar11);
    uVar169 = auVar13._0_8_;
    auVar270._8_8_ = uVar169;
    auVar270._0_8_ = uVar169;
    auVar270._16_8_ = uVar169;
    auVar270._24_8_ = uVar169;
    fVar65 = auVar84._0_4_;
    auVar96._4_4_ = fVar65;
    auVar96._0_4_ = fVar65;
    auVar96._8_4_ = fVar65;
    auVar96._12_4_ = fVar65;
    auVar96._16_4_ = fVar65;
    auVar96._20_4_ = fVar65;
    auVar96._24_4_ = fVar65;
    auVar96._28_4_ = fVar65;
    auVar9 = vmovshdup_avx(auVar84);
    auVar181._0_8_ = auVar9._0_8_;
    auVar181._8_8_ = auVar181._0_8_;
    auVar181._16_8_ = auVar181._0_8_;
    auVar181._24_8_ = auVar181._0_8_;
    fVar167 = auVar67._0_4_;
    auVar254._4_4_ = fVar167;
    auVar254._0_4_ = fVar167;
    auVar254._8_4_ = fVar167;
    auVar254._12_4_ = fVar167;
    auVar254._16_4_ = fVar167;
    auVar254._20_4_ = fVar167;
    auVar254._24_4_ = fVar167;
    auVar254._28_4_ = fVar167;
    auVar277 = vmovshdup_avx(auVar67);
    auVar231._0_8_ = auVar277._0_8_;
    auVar231._8_8_ = auVar231._0_8_;
    auVar231._16_8_ = auVar231._0_8_;
    auVar231._24_8_ = auVar231._0_8_;
    local_478 = auVar213._0_4_;
    auVar10 = vmovshdup_avx(auVar213);
    auVar114 = vfmadd132ps_fma(auVar82,auVar221,_DAT_02020f20);
    auVar82 = vsubps_avx(auVar123,ZEXT1632(auVar114));
    fVar144 = auVar114._0_4_;
    auVar282._0_4_ = fVar65 * fVar144;
    fVar162 = auVar114._4_4_;
    auVar282._4_4_ = fVar65 * fVar162;
    fVar164 = auVar114._8_4_;
    auVar282._8_4_ = fVar65 * fVar164;
    fVar166 = auVar114._12_4_;
    auVar282._12_4_ = fVar65 * fVar166;
    auVar282._16_4_ = fVar65 * 0.0;
    auVar282._20_4_ = fVar65 * 0.0;
    auVar282._28_36_ = auVar281._28_36_;
    auVar282._24_4_ = fVar65 * 0.0;
    auVar114 = vfmadd231ps_fma(auVar282._0_32_,auVar82,auVar288);
    fVar145 = auVar9._0_4_;
    fVar184 = auVar9._4_4_;
    auVar14._4_4_ = fVar184 * fVar162;
    auVar14._0_4_ = fVar145 * fVar144;
    auVar14._8_4_ = fVar145 * fVar164;
    auVar14._12_4_ = fVar184 * fVar166;
    auVar14._16_4_ = fVar145 * 0.0;
    auVar14._20_4_ = fVar184 * 0.0;
    auVar14._24_4_ = fVar145 * 0.0;
    auVar14._28_4_ = local_478;
    auVar128 = vfmadd231ps_fma(auVar14,auVar82,auVar270);
    auVar15._4_4_ = fVar167 * fVar162;
    auVar15._0_4_ = fVar167 * fVar144;
    auVar15._8_4_ = fVar167 * fVar164;
    auVar15._12_4_ = fVar167 * fVar166;
    auVar15._16_4_ = fVar167 * 0.0;
    auVar15._20_4_ = fVar167 * 0.0;
    auVar15._24_4_ = fVar167 * 0.0;
    auVar15._28_4_ = auVar13._4_4_;
    auVar66 = vfmadd231ps_fma(auVar15,auVar82,auVar96);
    fVar145 = auVar277._0_4_;
    fVar184 = auVar277._4_4_;
    auVar16._4_4_ = fVar184 * fVar162;
    auVar16._0_4_ = fVar145 * fVar144;
    auVar16._8_4_ = fVar145 * fVar164;
    auVar16._12_4_ = fVar184 * fVar166;
    auVar16._16_4_ = fVar145 * 0.0;
    auVar16._20_4_ = fVar184 * 0.0;
    auVar16._24_4_ = fVar145 * 0.0;
    auVar16._28_4_ = uVar64;
    auVar133 = vfmadd231ps_fma(auVar16,auVar82,auVar181);
    auVar13 = vshufps_avx(auVar11,auVar11,0xaa);
    auVar182._0_8_ = auVar13._0_8_;
    auVar182._8_8_ = auVar182._0_8_;
    auVar182._16_8_ = auVar182._0_8_;
    auVar182._24_8_ = auVar182._0_8_;
    auVar9 = vshufps_avx(auVar11,auVar11,0xff);
    uStack_3f0 = auVar9._0_8_;
    local_3f8 = (undefined1  [8])uStack_3f0;
    uStack_3e8 = uStack_3f0;
    uStack_3e0 = uStack_3f0;
    auVar17._4_4_ = fVar162 * local_478;
    auVar17._0_4_ = fVar144 * local_478;
    auVar17._8_4_ = fVar164 * local_478;
    auVar17._12_4_ = fVar166 * local_478;
    auVar17._16_4_ = local_478 * 0.0;
    auVar17._20_4_ = local_478 * 0.0;
    auVar17._24_4_ = local_478 * 0.0;
    auVar17._28_4_ = 0x3f800000;
    auVar127 = vfmadd231ps_fma(auVar17,auVar82,auVar254);
    auVar277 = vshufps_avx(auVar84,auVar84,0xaa);
    auVar141._0_8_ = auVar277._0_8_;
    auVar141._8_8_ = auVar141._0_8_;
    auVar141._16_8_ = auVar141._0_8_;
    auVar141._24_8_ = auVar141._0_8_;
    auVar11 = vshufps_avx(auVar84,auVar84,0xff);
    auVar160._0_8_ = auVar11._0_8_;
    auVar160._8_8_ = auVar160._0_8_;
    auVar160._16_8_ = auVar160._0_8_;
    auVar160._24_8_ = auVar160._0_8_;
    fVar145 = auVar10._0_4_;
    fVar184 = auVar10._4_4_;
    auVar261._4_4_ = fVar184 * fVar162;
    auVar261._0_4_ = fVar145 * fVar144;
    auVar261._8_4_ = fVar145 * fVar164;
    auVar261._12_4_ = fVar184 * fVar166;
    auVar261._16_4_ = fVar145 * 0.0;
    auVar261._20_4_ = fVar184 * 0.0;
    auVar261._24_4_ = fVar145 * 0.0;
    auVar261._28_4_ = fVar167;
    auVar146 = vfmadd231ps_fma(auVar261,auVar82,auVar231);
    auVar19._28_4_ = fVar65;
    auVar19._0_28_ =
         ZEXT1628(CONCAT412(auVar66._12_4_ * fVar166,
                            CONCAT48(auVar66._8_4_ * fVar164,
                                     CONCAT44(auVar66._4_4_ * fVar162,auVar66._0_4_ * fVar144))));
    auVar114 = vfmadd231ps_fma(auVar19,auVar82,ZEXT1632(auVar114));
    auVar20._28_4_ = auVar9._4_4_;
    auVar20._0_28_ =
         ZEXT1628(CONCAT412(auVar133._12_4_ * fVar166,
                            CONCAT48(auVar133._8_4_ * fVar164,
                                     CONCAT44(auVar133._4_4_ * fVar162,auVar133._0_4_ * fVar144))));
    auVar128 = vfmadd231ps_fma(auVar20,auVar82,ZEXT1632(auVar128));
    auVar9 = vshufps_avx(auVar67,auVar67,0xaa);
    uVar169 = auVar9._0_8_;
    auVar260._8_8_ = uVar169;
    auVar260._0_8_ = uVar169;
    auVar260._16_8_ = uVar169;
    auVar260._24_8_ = uVar169;
    auVar10 = vshufps_avx(auVar67,auVar67,0xff);
    uVar169 = auVar10._0_8_;
    auVar279._8_8_ = uVar169;
    auVar279._0_8_ = uVar169;
    auVar279._16_8_ = uVar169;
    auVar279._24_8_ = uVar169;
    auVar66 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar166 * auVar127._12_4_,
                                                 CONCAT48(fVar164 * auVar127._8_4_,
                                                          CONCAT44(fVar162 * auVar127._4_4_,
                                                                   fVar144 * auVar127._0_4_)))),
                              auVar82,ZEXT1632(auVar66));
    auVar84 = vshufps_avx(auVar213,auVar213,0xaa);
    auVar67 = vshufps_avx(auVar213,auVar213,0xff);
    local_478 = auVar67._0_4_;
    fStack_474 = auVar67._4_4_;
    auVar21._28_4_ = fStack_474;
    auVar21._0_28_ =
         ZEXT1628(CONCAT412(auVar146._12_4_ * fVar166,
                            CONCAT48(auVar146._8_4_ * fVar164,
                                     CONCAT44(auVar146._4_4_ * fVar162,auVar146._0_4_ * fVar144))));
    auVar67 = vfmadd231ps_fma(auVar21,auVar82,ZEXT1632(auVar133));
    auVar213 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar166 * auVar66._12_4_,
                                                  CONCAT48(fVar164 * auVar66._8_4_,
                                                           CONCAT44(fVar162 * auVar66._4_4_,
                                                                    fVar144 * auVar66._0_4_)))),
                               auVar82,ZEXT1632(auVar114));
    auVar14 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar114));
    auVar114 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar166 * auVar67._12_4_,
                                                  CONCAT48(fVar164 * auVar67._8_4_,
                                                           CONCAT44(fVar162 * auVar67._4_4_,
                                                                    fVar144 * auVar67._0_4_)))),
                               auVar82,ZEXT1632(auVar128));
    auVar15 = vsubps_avx(ZEXT1632(auVar67),ZEXT1632(auVar128));
    fVar161 = fVar83 * auVar14._0_4_ * 3.0;
    fVar165 = fVar83 * auVar14._4_4_ * 3.0;
    auVar22._4_4_ = fVar165;
    auVar22._0_4_ = fVar161;
    fVar272 = fVar83 * auVar14._8_4_ * 3.0;
    auVar22._8_4_ = fVar272;
    fVar274 = fVar83 * auVar14._12_4_ * 3.0;
    auVar22._12_4_ = fVar274;
    fStack_468 = fVar83 * auVar14._16_4_ * 3.0;
    auVar22._16_4_ = fStack_468;
    fStack_464 = fVar83 * auVar14._20_4_ * 3.0;
    auVar22._20_4_ = fStack_464;
    fStack_460 = fVar83 * auVar14._24_4_ * 3.0;
    auVar22._24_4_ = fStack_460;
    auVar22._28_4_ = 0x40400000;
    local_418._0_4_ = fVar83 * auVar15._0_4_ * 3.0;
    local_418._4_4_ = fVar83 * auVar15._4_4_ * 3.0;
    fStack_410 = fVar83 * auVar15._8_4_ * 3.0;
    fStack_40c = fVar83 * auVar15._12_4_ * 3.0;
    fStack_408 = fVar83 * auVar15._16_4_ * 3.0;
    fStack_404 = fVar83 * auVar15._20_4_ * 3.0;
    fStack_400 = fVar83 * auVar15._24_4_ * 3.0;
    fStack_3fc = auVar15._28_4_;
    fVar65 = auVar277._0_4_;
    fVar145 = auVar277._4_4_;
    auVar23._4_4_ = fVar145 * fVar162;
    auVar23._0_4_ = fVar65 * fVar144;
    auVar23._8_4_ = fVar65 * fVar164;
    auVar23._12_4_ = fVar145 * fVar166;
    auVar23._16_4_ = fVar65 * 0.0;
    auVar23._20_4_ = fVar145 * 0.0;
    auVar23._24_4_ = fVar65 * 0.0;
    auVar23._28_4_ = auVar14._28_4_;
    auVar277 = vfmadd231ps_fma(auVar23,auVar82,auVar182);
    fVar65 = auVar11._0_4_;
    fVar184 = auVar11._4_4_;
    auVar24._4_4_ = fVar184 * fVar162;
    auVar24._0_4_ = fVar65 * fVar144;
    auVar24._8_4_ = fVar65 * fVar164;
    auVar24._12_4_ = fVar184 * fVar166;
    auVar24._16_4_ = fVar65 * 0.0;
    auVar24._20_4_ = fVar184 * 0.0;
    auVar24._24_4_ = fVar65 * 0.0;
    auVar24._28_4_ = auVar13._4_4_;
    auVar13 = vfmadd231ps_fma(auVar24,auVar82,_local_3f8);
    fVar65 = auVar9._0_4_;
    fVar184 = auVar9._4_4_;
    auVar25._4_4_ = fVar184 * fVar162;
    auVar25._0_4_ = fVar65 * fVar144;
    auVar25._8_4_ = fVar65 * fVar164;
    auVar25._12_4_ = fVar184 * fVar166;
    auVar25._16_4_ = fVar65 * 0.0;
    auVar25._20_4_ = fVar184 * 0.0;
    auVar25._24_4_ = fVar65 * 0.0;
    auVar25._28_4_ = fVar83;
    auVar9 = vfmadd231ps_fma(auVar25,auVar82,auVar141);
    fVar65 = auVar10._0_4_;
    fVar167 = auVar10._4_4_;
    auVar26._4_4_ = fVar167 * fVar162;
    auVar26._0_4_ = fVar65 * fVar144;
    auVar26._8_4_ = fVar65 * fVar164;
    auVar26._12_4_ = fVar167 * fVar166;
    auVar26._16_4_ = fVar65 * 0.0;
    auVar26._20_4_ = fVar167 * 0.0;
    auVar26._24_4_ = fVar65 * 0.0;
    auVar26._28_4_ = fVar145;
    auVar10 = vfmadd231ps_fma(auVar26,auVar82,auVar160);
    local_218 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar213));
    fVar65 = auVar84._0_4_;
    fVar145 = auVar84._4_4_;
    auVar27._4_4_ = fVar145 * fVar162;
    auVar27._0_4_ = fVar65 * fVar144;
    auVar27._8_4_ = fVar65 * fVar164;
    auVar27._12_4_ = fVar145 * fVar166;
    auVar27._16_4_ = fVar65 * 0.0;
    auVar27._20_4_ = fVar145 * 0.0;
    auVar27._24_4_ = fVar65 * 0.0;
    auVar27._28_4_ = local_218._28_4_;
    auVar11 = vfmadd231ps_fma(auVar27,auVar82,auVar260);
    _local_3f8 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar114));
    auVar28._4_4_ = fVar162 * fStack_474;
    auVar28._0_4_ = fVar144 * local_478;
    auVar28._8_4_ = fVar164 * local_478;
    auVar28._12_4_ = fVar166 * fStack_474;
    auVar28._16_4_ = local_478 * 0.0;
    auVar28._20_4_ = fStack_474 * 0.0;
    auVar28._24_4_ = local_478 * 0.0;
    auVar28._28_4_ = fVar184;
    auVar84 = vfmadd231ps_fma(auVar28,auVar82,auVar279);
    auVar29._28_4_ = fVar145;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(fVar166 * auVar9._12_4_,
                            CONCAT48(fVar164 * auVar9._8_4_,
                                     CONCAT44(fVar162 * auVar9._4_4_,fVar144 * auVar9._0_4_))));
    auVar277 = vfmadd231ps_fma(auVar29,auVar82,ZEXT1632(auVar277));
    auVar13 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar166 * auVar10._12_4_,
                                                 CONCAT48(fVar164 * auVar10._8_4_,
                                                          CONCAT44(fVar162 * auVar10._4_4_,
                                                                   fVar144 * auVar10._0_4_)))),
                              auVar82,ZEXT1632(auVar13));
    fVar161 = auVar213._0_4_ + fVar161;
    fVar165 = auVar213._4_4_ + fVar165;
    fVar272 = auVar213._8_4_ + fVar272;
    fVar274 = auVar213._12_4_ + fVar274;
    fStack_468 = fStack_468 + 0.0;
    fStack_464 = fStack_464 + 0.0;
    fStack_460 = fStack_460 + 0.0;
    uStack_45c = 0x40400000;
    auVar30._28_4_ = 0x40400000;
    auVar30._0_28_ =
         ZEXT1628(CONCAT412(auVar84._12_4_ * fVar166,
                            CONCAT48(auVar84._8_4_ * fVar164,
                                     CONCAT44(auVar84._4_4_ * fVar162,auVar84._0_4_ * fVar144))));
    auVar9 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar166 * auVar11._12_4_,
                                                CONCAT48(fVar164 * auVar11._8_4_,
                                                         CONCAT44(fVar162 * auVar11._4_4_,
                                                                  fVar144 * auVar11._0_4_)))),
                             auVar82,ZEXT1632(auVar9));
    auVar10 = vfmadd231ps_fma(auVar30,auVar82,ZEXT1632(auVar10));
    auVar11 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar166 * auVar9._12_4_,
                                                 CONCAT48(fVar164 * auVar9._8_4_,
                                                          CONCAT44(fVar162 * auVar9._4_4_,
                                                                   fVar144 * auVar9._0_4_)))),
                              auVar82,ZEXT1632(auVar277));
    auVar84 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar166 * auVar10._12_4_,
                                                 CONCAT48(fVar164 * auVar10._8_4_,
                                                          CONCAT44(fVar162 * auVar10._4_4_,
                                                                   fVar144 * auVar10._0_4_)))),
                              ZEXT1632(auVar13),auVar82);
    auVar82 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar277));
    auVar14 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar13));
    fVar144 = fVar83 * auVar82._0_4_ * 3.0;
    fVar162 = fVar83 * auVar82._4_4_ * 3.0;
    auVar31._4_4_ = fVar162;
    auVar31._0_4_ = fVar144;
    fVar164 = fVar83 * auVar82._8_4_ * 3.0;
    auVar31._8_4_ = fVar164;
    fVar166 = fVar83 * auVar82._12_4_ * 3.0;
    auVar31._12_4_ = fVar166;
    fVar167 = fVar83 * auVar82._16_4_ * 3.0;
    auVar31._16_4_ = fVar167;
    fVar168 = fVar83 * auVar82._20_4_ * 3.0;
    auVar31._20_4_ = fVar168;
    fVar143 = fVar83 * auVar82._24_4_ * 3.0;
    auVar31._24_4_ = fVar143;
    auVar31._28_4_ = 0x40400000;
    auVar204._0_4_ = fVar83 * auVar14._0_4_ * 3.0;
    auVar204._4_4_ = fVar83 * auVar14._4_4_ * 3.0;
    auVar204._8_4_ = fVar83 * auVar14._8_4_ * 3.0;
    auVar204._12_4_ = fVar83 * auVar14._12_4_ * 3.0;
    auVar204._16_4_ = fVar83 * auVar14._16_4_ * 3.0;
    auVar204._20_4_ = fVar83 * auVar14._20_4_ * 3.0;
    auVar204._24_4_ = fVar83 * auVar14._24_4_ * 3.0;
    auVar204._28_4_ = 0;
    local_458 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar11));
    local_78 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar84));
    auVar82 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar213));
    auVar14 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar114));
    auVar16 = vsubps_avx(local_458,local_218);
    fVar163 = auVar82._0_4_ + auVar16._0_4_;
    fVar262 = auVar82._4_4_ + auVar16._4_4_;
    fVar273 = auVar82._8_4_ + auVar16._8_4_;
    fVar185 = auVar82._12_4_ + auVar16._12_4_;
    fVar186 = auVar82._16_4_ + auVar16._16_4_;
    fVar187 = auVar82._20_4_ + auVar16._20_4_;
    fVar188 = auVar82._24_4_ + auVar16._24_4_;
    auVar17 = vsubps_avx(local_78,_local_3f8);
    auVar271._0_4_ = auVar14._0_4_ + auVar17._0_4_;
    auVar271._4_4_ = auVar14._4_4_ + auVar17._4_4_;
    auVar271._8_4_ = auVar14._8_4_ + auVar17._8_4_;
    auVar271._12_4_ = auVar14._12_4_ + auVar17._12_4_;
    auVar271._16_4_ = auVar14._16_4_ + auVar17._16_4_;
    auVar271._20_4_ = auVar14._20_4_ + auVar17._20_4_;
    auVar271._24_4_ = auVar14._24_4_ + auVar17._24_4_;
    auVar271._28_4_ = auVar14._28_4_ + auVar17._28_4_;
    fVar83 = auVar114._0_4_;
    local_158 = fVar83 + (float)local_418._0_4_;
    fVar65 = auVar114._4_4_;
    fStack_154 = fVar65 + (float)local_418._4_4_;
    fVar145 = auVar114._8_4_;
    fStack_150 = fVar145 + fStack_410;
    fVar184 = auVar114._12_4_;
    fStack_14c = fVar184 + fStack_40c;
    fStack_148 = fStack_408 + 0.0;
    fStack_144 = fStack_404 + 0.0;
    fStack_140 = fStack_400 + 0.0;
    fStack_13c = auVar15._28_4_ + 0.0;
    local_98 = ZEXT1632(auVar213);
    auVar14 = vsubps_avx(local_98,auVar22);
    local_d8 = vpermps_avx2(_DAT_0205d4a0,auVar14);
    local_b8 = ZEXT1632(auVar114);
    auVar14 = vsubps_avx(local_b8,_local_418);
    local_178 = vpermps_avx2(_DAT_0205d4a0,auVar14);
    local_f8._0_4_ = auVar11._0_4_ + fVar144;
    local_f8._4_4_ = auVar11._4_4_ + fVar162;
    local_f8._8_4_ = auVar11._8_4_ + fVar164;
    local_f8._12_4_ = auVar11._12_4_ + fVar166;
    local_f8._16_4_ = fVar167 + 0.0;
    local_f8._20_4_ = fVar168 + 0.0;
    local_f8._24_4_ = fVar143 + 0.0;
    local_f8._28_4_ = 0x40400000;
    auVar261 = ZEXT1632(auVar11);
    auVar14 = vsubps_avx(auVar261,auVar31);
    _local_418 = vpermps_avx2(_DAT_0205d4a0,auVar14);
    fVar144 = auVar84._0_4_;
    local_138._0_4_ = fVar144 + auVar204._0_4_;
    fVar162 = auVar84._4_4_;
    local_138._4_4_ = fVar162 + auVar204._4_4_;
    fVar164 = auVar84._8_4_;
    local_138._8_4_ = fVar164 + auVar204._8_4_;
    fVar166 = auVar84._12_4_;
    local_138._12_4_ = fVar166 + auVar204._12_4_;
    local_138._16_4_ = auVar204._16_4_ + 0.0;
    local_138._20_4_ = auVar204._20_4_ + 0.0;
    local_138._24_4_ = auVar204._24_4_ + 0.0;
    local_138._28_4_ = 0;
    auVar14 = vsubps_avx(ZEXT1632(auVar84),auVar204);
    local_118 = vpermps_avx2(_DAT_0205d4a0,auVar14);
    auVar32._4_4_ = fVar65 * fVar262;
    auVar32._0_4_ = fVar83 * fVar163;
    auVar32._8_4_ = fVar145 * fVar273;
    auVar32._12_4_ = fVar184 * fVar185;
    auVar32._16_4_ = fVar186 * 0.0;
    auVar32._20_4_ = fVar187 * 0.0;
    auVar32._24_4_ = fVar188 * 0.0;
    auVar32._28_4_ = auVar14._28_4_;
    auVar13 = vfnmadd231ps_fma(auVar32,local_98,auVar271);
    auVar33._4_4_ = fStack_154 * fVar262;
    auVar33._0_4_ = local_158 * fVar163;
    auVar33._8_4_ = fStack_150 * fVar273;
    auVar33._12_4_ = fStack_14c * fVar185;
    auVar33._16_4_ = fStack_148 * fVar186;
    auVar33._20_4_ = fStack_144 * fVar187;
    auVar33._24_4_ = fStack_140 * fVar188;
    auVar33._28_4_ = local_418._28_4_;
    auVar46._4_4_ = fVar165;
    auVar46._0_4_ = fVar161;
    auVar46._8_4_ = fVar272;
    auVar46._12_4_ = fVar274;
    auVar46._16_4_ = fStack_468;
    auVar46._20_4_ = fStack_464;
    auVar46._24_4_ = fStack_460;
    auVar46._28_4_ = 0x40400000;
    auVar9 = vfnmadd231ps_fma(auVar33,auVar271,auVar46);
    auVar34._4_4_ = local_178._4_4_ * fVar262;
    auVar34._0_4_ = local_178._0_4_ * fVar163;
    auVar34._8_4_ = local_178._8_4_ * fVar273;
    auVar34._12_4_ = local_178._12_4_ * fVar185;
    auVar34._16_4_ = local_178._16_4_ * fVar186;
    auVar34._20_4_ = local_178._20_4_ * fVar187;
    auVar34._24_4_ = local_178._24_4_ * fVar188;
    auVar34._28_4_ = fStack_13c;
    auVar277 = vfnmadd231ps_fma(auVar34,local_d8,auVar271);
    auVar35._4_4_ = fVar262 * (float)local_3f8._4_4_;
    auVar35._0_4_ = fVar163 * (float)local_3f8._0_4_;
    auVar35._8_4_ = fVar273 * (float)uStack_3f0;
    auVar35._12_4_ = fVar185 * uStack_3f0._4_4_;
    auVar35._16_4_ = fVar186 * (float)uStack_3e8;
    auVar35._20_4_ = fVar187 * uStack_3e8._4_4_;
    auVar35._24_4_ = fVar188 * (float)uStack_3e0;
    auVar35._28_4_ = local_178._28_4_;
    auVar10 = vfnmadd231ps_fma(auVar35,local_218,auVar271);
    auVar53._4_4_ = fVar162 * fVar262;
    auVar53._0_4_ = fVar144 * fVar163;
    auVar53._8_4_ = fVar164 * fVar273;
    auVar53._12_4_ = fVar166 * fVar185;
    auVar53._16_4_ = fVar186 * 0.0;
    auVar53._20_4_ = fVar187 * 0.0;
    auVar53._24_4_ = fVar188 * 0.0;
    auVar53._28_4_ = DAT_0205d4a0._28_4_;
    auVar11 = vfnmadd231ps_fma(auVar53,auVar261,auVar271);
    auVar36._4_4_ = local_138._4_4_ * fVar262;
    auVar36._0_4_ = local_138._0_4_ * fVar163;
    auVar36._8_4_ = local_138._8_4_ * fVar273;
    auVar36._12_4_ = local_138._12_4_ * fVar185;
    auVar36._16_4_ = local_138._16_4_ * fVar186;
    auVar36._20_4_ = local_138._20_4_ * fVar187;
    auVar36._24_4_ = local_138._24_4_ * fVar188;
    auVar36._28_4_ = local_218._28_4_;
    auVar67 = vfnmadd231ps_fma(auVar36,local_f8,auVar271);
    auVar37._4_4_ = local_118._4_4_ * fVar262;
    auVar37._0_4_ = local_118._0_4_ * fVar163;
    auVar37._8_4_ = local_118._8_4_ * fVar273;
    auVar37._12_4_ = local_118._12_4_ * fVar185;
    auVar37._16_4_ = local_118._16_4_ * fVar186;
    auVar37._20_4_ = local_118._20_4_ * fVar187;
    auVar37._24_4_ = local_118._24_4_ * fVar188;
    auVar37._28_4_ = local_d8._28_4_;
    auVar213 = vfnmadd231ps_fma(auVar37,auVar271,_local_418);
    auVar38._4_4_ = local_78._4_4_ * fVar262;
    auVar38._0_4_ = local_78._0_4_ * fVar163;
    auVar38._8_4_ = local_78._8_4_ * fVar273;
    auVar38._12_4_ = local_78._12_4_ * fVar185;
    auVar38._16_4_ = local_78._16_4_ * fVar186;
    auVar38._20_4_ = local_78._20_4_ * fVar187;
    auVar38._24_4_ = local_78._24_4_ * fVar188;
    auVar38._28_4_ = auVar82._28_4_ + auVar16._28_4_;
    auVar114 = vfnmadd231ps_fma(auVar38,auVar271,local_458);
    auVar14 = vminps_avx(ZEXT1632(auVar13),ZEXT1632(auVar9));
    auVar82 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar9));
    auVar15 = vminps_avx(ZEXT1632(auVar277),ZEXT1632(auVar10));
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar277),ZEXT1632(auVar10));
    auVar82 = vmaxps_avx(auVar82,auVar14);
    auVar16 = vminps_avx(ZEXT1632(auVar11),ZEXT1632(auVar67));
    auVar14 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar67));
    auVar17 = vminps_avx(ZEXT1632(auVar213),ZEXT1632(auVar114));
    auVar16 = vminps_avx(auVar16,auVar17);
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(ZEXT1632(auVar213),ZEXT1632(auVar114));
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar82,auVar14);
    auVar52._4_4_ = fStack_194;
    auVar52._0_4_ = local_198;
    auVar52._8_4_ = fStack_190;
    auVar52._12_4_ = fStack_18c;
    auVar52._16_4_ = fStack_188;
    auVar52._20_4_ = fStack_184;
    auVar52._24_4_ = fStack_180;
    auVar52._28_4_ = fStack_17c;
    auVar82 = vcmpps_avx(auVar16,auVar52,2);
    auVar51._4_4_ = fStack_1b4;
    auVar51._0_4_ = local_1b8;
    auVar51._8_4_ = fStack_1b0;
    auVar51._12_4_ = fStack_1ac;
    auVar51._16_4_ = fStack_1a8;
    auVar51._20_4_ = fStack_1a4;
    auVar51._24_4_ = fStack_1a0;
    auVar51._28_4_ = fStack_19c;
    auVar14 = vcmpps_avx(auVar14,auVar51,5);
    auVar82 = vandps_avx(auVar14,auVar82);
    auVar14 = local_1f8 & auVar82;
    uVar54 = 0;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar14 = vsubps_avx(local_218,local_98);
      auVar15 = vsubps_avx(local_458,auVar261);
      fVar168 = auVar14._0_4_ + auVar15._0_4_;
      fVar143 = auVar14._4_4_ + auVar15._4_4_;
      fVar163 = auVar14._8_4_ + auVar15._8_4_;
      fVar262 = auVar14._12_4_ + auVar15._12_4_;
      fVar273 = auVar14._16_4_ + auVar15._16_4_;
      fVar185 = auVar14._20_4_ + auVar15._20_4_;
      fVar186 = auVar14._24_4_ + auVar15._24_4_;
      auVar16 = vsubps_avx(_local_3f8,local_b8);
      auVar17 = vsubps_avx(local_78,ZEXT1632(auVar84));
      auVar97._0_4_ = auVar16._0_4_ + auVar17._0_4_;
      auVar97._4_4_ = auVar16._4_4_ + auVar17._4_4_;
      auVar97._8_4_ = auVar16._8_4_ + auVar17._8_4_;
      auVar97._12_4_ = auVar16._12_4_ + auVar17._12_4_;
      auVar97._16_4_ = auVar16._16_4_ + auVar17._16_4_;
      auVar97._20_4_ = auVar16._20_4_ + auVar17._20_4_;
      auVar97._24_4_ = auVar16._24_4_ + auVar17._24_4_;
      fVar167 = auVar17._28_4_;
      auVar97._28_4_ = auVar16._28_4_ + fVar167;
      auVar280._0_4_ = fVar83 * fVar168;
      auVar280._4_4_ = fVar65 * fVar143;
      auVar280._8_4_ = fVar145 * fVar163;
      auVar280._12_4_ = fVar184 * fVar262;
      auVar280._16_4_ = fVar273 * 0.0;
      auVar280._20_4_ = fVar185 * 0.0;
      auVar280._24_4_ = fVar186 * 0.0;
      auVar280._28_4_ = 0;
      auVar11 = vfnmadd231ps_fma(auVar280,auVar97,local_98);
      auVar39._4_4_ = fVar143 * fStack_154;
      auVar39._0_4_ = fVar168 * local_158;
      auVar39._8_4_ = fVar163 * fStack_150;
      auVar39._12_4_ = fVar262 * fStack_14c;
      auVar39._16_4_ = fVar273 * fStack_148;
      auVar39._20_4_ = fVar185 * fStack_144;
      auVar39._24_4_ = fVar186 * fStack_140;
      auVar39._28_4_ = fVar167;
      auVar47._4_4_ = fVar165;
      auVar47._0_4_ = fVar161;
      auVar47._8_4_ = fVar272;
      auVar47._12_4_ = fVar274;
      auVar47._16_4_ = fStack_468;
      auVar47._20_4_ = fStack_464;
      auVar47._24_4_ = fStack_460;
      auVar47._28_4_ = 0x40400000;
      auVar13 = vfnmadd213ps_fma(auVar47,auVar97,auVar39);
      auVar40._4_4_ = fVar143 * local_178._4_4_;
      auVar40._0_4_ = fVar168 * local_178._0_4_;
      auVar40._8_4_ = fVar163 * local_178._8_4_;
      auVar40._12_4_ = fVar262 * local_178._12_4_;
      auVar40._16_4_ = fVar273 * local_178._16_4_;
      auVar40._20_4_ = fVar185 * local_178._20_4_;
      auVar40._24_4_ = fVar186 * local_178._24_4_;
      auVar40._28_4_ = fVar167;
      auVar9 = vfnmadd213ps_fma(local_d8,auVar97,auVar40);
      auVar41._4_4_ = (float)local_3f8._4_4_ * fVar143;
      auVar41._0_4_ = (float)local_3f8._0_4_ * fVar168;
      auVar41._8_4_ = (float)uStack_3f0 * fVar163;
      auVar41._12_4_ = uStack_3f0._4_4_ * fVar262;
      auVar41._16_4_ = (float)uStack_3e8 * fVar273;
      auVar41._20_4_ = uStack_3e8._4_4_ * fVar185;
      auVar41._24_4_ = (float)uStack_3e0 * fVar186;
      auVar41._28_4_ = fVar167;
      auVar84 = vfnmadd231ps_fma(auVar41,auVar97,local_218);
      auVar111._0_4_ = fVar144 * fVar168;
      auVar111._4_4_ = fVar162 * fVar143;
      auVar111._8_4_ = fVar164 * fVar163;
      auVar111._12_4_ = fVar166 * fVar262;
      auVar111._16_4_ = fVar273 * 0.0;
      auVar111._20_4_ = fVar185 * 0.0;
      auVar111._24_4_ = fVar186 * 0.0;
      auVar111._28_4_ = 0;
      auVar67 = vfnmadd231ps_fma(auVar111,auVar97,auVar261);
      auVar42._4_4_ = fVar143 * local_138._4_4_;
      auVar42._0_4_ = fVar168 * local_138._0_4_;
      auVar42._8_4_ = fVar163 * local_138._8_4_;
      auVar42._12_4_ = fVar262 * local_138._12_4_;
      auVar42._16_4_ = fVar273 * local_138._16_4_;
      auVar42._20_4_ = fVar185 * local_138._20_4_;
      auVar42._24_4_ = fVar186 * local_138._24_4_;
      auVar42._28_4_ = local_3f8._28_4_;
      auVar277 = vfnmadd213ps_fma(local_f8,auVar97,auVar42);
      auVar43._4_4_ = fVar143 * local_118._4_4_;
      auVar43._0_4_ = fVar168 * local_118._0_4_;
      auVar43._8_4_ = fVar163 * local_118._8_4_;
      auVar43._12_4_ = fVar262 * local_118._12_4_;
      auVar43._16_4_ = fVar273 * local_118._16_4_;
      auVar43._20_4_ = fVar185 * local_118._20_4_;
      auVar43._24_4_ = fVar186 * local_118._24_4_;
      auVar43._28_4_ = local_3f8._28_4_;
      auVar10 = vfnmadd213ps_fma(_local_418,auVar97,auVar43);
      auVar44._4_4_ = local_78._4_4_ * fVar143;
      auVar44._0_4_ = local_78._0_4_ * fVar168;
      auVar44._8_4_ = local_78._8_4_ * fVar163;
      auVar44._12_4_ = local_78._12_4_ * fVar262;
      auVar44._16_4_ = local_78._16_4_ * fVar273;
      auVar44._20_4_ = local_78._20_4_ * fVar185;
      auVar44._24_4_ = local_78._24_4_ * fVar186;
      auVar44._28_4_ = auVar14._28_4_ + auVar15._28_4_;
      auVar213 = vfnmadd231ps_fma(auVar44,auVar97,local_458);
      auVar15 = vminps_avx(ZEXT1632(auVar11),ZEXT1632(auVar13));
      auVar14 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar13));
      auVar16 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar84));
      auVar16 = vminps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar84));
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar17 = vminps_avx(ZEXT1632(auVar67),ZEXT1632(auVar277));
      auVar15 = vmaxps_avx(ZEXT1632(auVar67),ZEXT1632(auVar277));
      auVar261 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar213));
      auVar17 = vminps_avx(auVar17,auVar261);
      auVar17 = vminps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar213));
      auVar15 = vmaxps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vcmpps_avx(auVar17,auVar52,2);
      auVar15 = vcmpps_avx(auVar15,auVar51,5);
      auVar14 = vandps_avx(auVar15,auVar14);
      auVar82 = vandps_avx(auVar82,local_1f8);
      auVar15 = auVar82 & auVar14;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0x7f,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0xbf,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar15[0x1f] < '\0') {
        auVar82 = vandps_avx(auVar14,auVar82);
        uVar54 = vmovmskps_avx(auVar82);
      }
    }
    if (uVar54 != 0) {
      auStack_2f8[uVar56] = uVar54;
      uVar169 = vmovlps_avx(local_268);
      *(undefined8 *)(&uStack_1d8 + uVar56 * 2) = uVar169;
      uVar61 = vmovlps_avx(local_4b8);
      auStack_58[uVar56] = uVar61;
      uVar56 = (ulong)((int)uVar56 + 1);
    }
    do {
      if ((int)uVar56 == 0) {
        if ((uVar62 & 1) != 0) {
          return local_539;
        }
        fVar144 = ray->tfar;
        auVar81._4_4_ = fVar144;
        auVar81._0_4_ = fVar144;
        auVar81._8_4_ = fVar144;
        auVar81._12_4_ = fVar144;
        auVar13 = vcmpps_avx(local_278,auVar81,2);
        uVar54 = vmovmskps_avx(auVar13);
        uVar54 = (uint)uVar63 & uVar54;
        local_539 = uVar54 != 0;
        if (!local_539) {
          return local_539;
        }
        goto LAB_016d35fb;
      }
      uVar55 = (int)uVar56 - 1;
      uVar57 = (ulong)uVar55;
      uVar60 = auStack_2f8[uVar57];
      uVar54 = (&uStack_1d8)[uVar57 * 2];
      fVar144 = afStack_1d4[uVar57 * 2];
      iVar18 = 0;
      for (uVar61 = (ulong)uVar60; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
        iVar18 = iVar18 + 1;
      }
      uVar60 = uVar60 - 1 & uVar60;
      if (uVar60 == 0) {
        uVar56 = (ulong)uVar55;
      }
      local_4b8._8_8_ = 0;
      local_4b8._0_8_ = auStack_58[uVar57];
      auStack_2f8[uVar57] = uVar60;
      fVar162 = (float)(iVar18 + 1) * 0.14285715;
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar144 * (float)iVar18 * 0.14285715)),
                                ZEXT416(uVar54),ZEXT416((uint)(1.0 - (float)iVar18 * 0.14285715)));
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar144 * fVar162)),ZEXT416(uVar54),
                               ZEXT416((uint)(1.0 - fVar162)));
      auVar281 = ZEXT1664(auVar9);
      fVar162 = auVar13._0_4_;
      local_478 = auVar9._0_4_;
      fVar144 = local_478 - fVar162;
      local_458._0_16_ = auVar13;
      fStack_474 = auVar9._4_4_;
      uStack_470 = auVar9._8_4_;
      uStack_46c = auVar9._12_4_;
      if (0.16666667 <= fVar144) break;
      auVar277 = vshufps_avx(local_4b8,local_4b8,0x50);
      auVar102._8_4_ = 0x3f800000;
      auVar102._0_8_ = &DAT_3f8000003f800000;
      auVar102._12_4_ = 0x3f800000;
      auVar10 = vsubps_avx(auVar102,auVar277);
      fVar164 = auVar277._0_4_;
      auVar117._0_4_ = fVar113 * fVar164;
      fVar166 = auVar277._4_4_;
      auVar117._4_4_ = fVar126 * fVar166;
      fVar83 = auVar277._8_4_;
      auVar117._8_4_ = fVar113 * fVar83;
      fVar65 = auVar277._12_4_;
      auVar117._12_4_ = fVar126 * fVar65;
      auVar131._0_4_ = fVar189 * fVar164;
      auVar131._4_4_ = fVar205 * fVar166;
      auVar131._8_4_ = fVar189 * fVar83;
      auVar131._12_4_ = fVar205 * fVar65;
      auVar154._0_4_ = fVar233 * fVar164;
      auVar154._4_4_ = fVar244 * fVar166;
      auVar154._8_4_ = fVar233 * fVar83;
      auVar154._12_4_ = fVar244 * fVar65;
      auVar89._0_4_ = fVar222 * fVar164;
      auVar89._4_4_ = fVar232 * fVar166;
      auVar89._8_4_ = fVar222 * fVar83;
      auVar89._12_4_ = fVar232 * fVar65;
      auVar277 = vfmadd231ps_fma(auVar117,auVar10,auVar284);
      auVar11 = vfmadd231ps_fma(auVar131,auVar10,auVar210);
      auVar84 = vfmadd231ps_fma(auVar154,auVar10,auVar88);
      auVar10 = vfmadd231ps_fma(auVar89,auVar101,auVar10);
      auVar112._16_16_ = auVar277;
      auVar112._0_16_ = auVar277;
      auVar124._16_16_ = auVar11;
      auVar124._0_16_ = auVar11;
      auVar142._16_16_ = auVar84;
      auVar142._0_16_ = auVar84;
      auVar183._4_4_ = fVar162;
      auVar183._0_4_ = fVar162;
      auVar183._8_4_ = fVar162;
      auVar183._12_4_ = fVar162;
      auVar183._20_4_ = local_478;
      auVar183._16_4_ = local_478;
      auVar183._24_4_ = local_478;
      auVar183._28_4_ = local_478;
      auVar82 = vsubps_avx(auVar124,auVar112);
      auVar11 = vfmadd213ps_fma(auVar82,auVar183,auVar112);
      auVar82 = vsubps_avx(auVar142,auVar124);
      auVar67 = vfmadd213ps_fma(auVar82,auVar183,auVar124);
      auVar277 = vsubps_avx(auVar10,auVar84);
      auVar125._16_16_ = auVar277;
      auVar125._0_16_ = auVar277;
      auVar277 = vfmadd213ps_fma(auVar125,auVar183,auVar142);
      auVar82 = vsubps_avx(ZEXT1632(auVar67),ZEXT1632(auVar11));
      auVar10 = vfmadd213ps_fma(auVar82,auVar183,ZEXT1632(auVar11));
      auVar82 = vsubps_avx(ZEXT1632(auVar277),ZEXT1632(auVar67));
      auVar277 = vfmadd213ps_fma(auVar82,auVar183,ZEXT1632(auVar67));
      auVar82 = vsubps_avx(ZEXT1632(auVar277),ZEXT1632(auVar10));
      auVar128 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar82,auVar183);
      fVar184 = auVar82._4_4_ * 3.0;
      fVar145 = fVar144 * 0.33333334;
      local_218._0_8_ =
           CONCAT44(auVar128._4_4_ + fVar145 * fVar184,
                    auVar128._0_4_ + fVar145 * auVar82._0_4_ * 3.0);
      local_218._8_4_ = auVar128._8_4_ + fVar145 * auVar82._8_4_ * 3.0;
      local_218._12_4_ = auVar128._12_4_ + fVar145 * auVar82._12_4_ * 3.0;
      auVar10 = vshufpd_avx(auVar128,auVar128,3);
      auVar11 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      _local_418 = auVar10;
      auVar14 = _local_418;
      auVar277 = vsubps_avx(auVar10,auVar128);
      _local_3f8 = auVar11;
      auVar84 = vsubps_avx(auVar11,(undefined1  [16])0x0);
      auVar103._0_4_ = auVar277._0_4_ + auVar84._0_4_;
      auVar103._4_4_ = auVar277._4_4_ + auVar84._4_4_;
      auVar103._8_4_ = auVar277._8_4_ + auVar84._8_4_;
      auVar103._12_4_ = auVar277._12_4_ + auVar84._12_4_;
      auVar277 = vshufps_avx(auVar128,auVar128,0xb1);
      auVar84 = vshufps_avx(local_218._0_16_,local_218._0_16_,0xb1);
      auVar264._4_4_ = auVar103._0_4_;
      auVar264._0_4_ = auVar103._0_4_;
      auVar264._8_4_ = auVar103._0_4_;
      auVar264._12_4_ = auVar103._0_4_;
      auVar67 = vshufps_avx(auVar103,auVar103,0x55);
      fVar164 = auVar67._0_4_;
      auVar194._0_4_ = auVar277._0_4_ * fVar164;
      fVar166 = auVar67._4_4_;
      auVar194._4_4_ = auVar277._4_4_ * fVar166;
      fVar83 = auVar67._8_4_;
      auVar194._8_4_ = auVar277._8_4_ * fVar83;
      fVar65 = auVar67._12_4_;
      auVar194._12_4_ = auVar277._12_4_ * fVar65;
      auVar211._0_4_ = auVar84._0_4_ * fVar164;
      auVar211._4_4_ = auVar84._4_4_ * fVar166;
      auVar211._8_4_ = auVar84._8_4_ * fVar83;
      auVar211._12_4_ = auVar84._12_4_ * fVar65;
      auVar213 = vfmadd231ps_fma(auVar194,auVar264,auVar128);
      auVar114 = vfmadd231ps_fma(auVar211,auVar264,local_218._0_16_);
      auVar84 = vshufps_avx(auVar213,auVar213,0xe8);
      auVar67 = vshufps_avx(auVar114,auVar114,0xe8);
      auVar277 = vcmpps_avx(auVar84,auVar67,1);
      uVar54 = vextractps_avx(auVar277,0);
      auVar66 = auVar114;
      if ((uVar54 & 1) == 0) {
        auVar66 = auVar213;
      }
      auVar132._0_4_ = fVar145 * auVar82._16_4_ * 3.0;
      auVar132._4_4_ = fVar145 * fVar184;
      auVar132._8_4_ = fVar145 * auVar82._24_4_ * 3.0;
      auVar132._12_4_ = fVar145 * local_478;
      auVar147 = vsubps_avx((undefined1  [16])0x0,auVar132);
      auVar133 = vshufps_avx(auVar147,auVar147,0xb1);
      auVar127 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar285._0_4_ = auVar133._0_4_ * fVar164;
      auVar285._4_4_ = auVar133._4_4_ * fVar166;
      auVar285._8_4_ = auVar133._8_4_ * fVar83;
      auVar285._12_4_ = auVar133._12_4_ * fVar65;
      auVar104._0_4_ = auVar127._0_4_ * fVar164;
      auVar104._4_4_ = auVar127._4_4_ * fVar166;
      auVar104._8_4_ = auVar127._8_4_ * fVar83;
      auVar104._12_4_ = auVar127._12_4_ * fVar65;
      auVar148 = vfmadd231ps_fma(auVar285,auVar264,auVar147);
      auVar190 = vfmadd231ps_fma(auVar104,(undefined1  [16])0x0,auVar264);
      auVar127 = vshufps_avx(auVar148,auVar148,0xe8);
      auVar146 = vshufps_avx(auVar190,auVar190,0xe8);
      auVar133 = vcmpps_avx(auVar127,auVar146,1);
      uVar54 = vextractps_avx(auVar133,0);
      auVar206 = auVar190;
      if ((uVar54 & 1) == 0) {
        auVar206 = auVar148;
      }
      auVar66 = vmaxss_avx(auVar206,auVar66);
      auVar84 = vminps_avx(auVar84,auVar67);
      auVar67 = vminps_avx(auVar127,auVar146);
      auVar67 = vminps_avx(auVar84,auVar67);
      auVar277 = vshufps_avx(auVar277,auVar277,0x55);
      auVar277 = vblendps_avx(auVar277,auVar133,2);
      auVar133 = vpslld_avx(auVar277,0x1f);
      auVar277 = vshufpd_avx(auVar114,auVar114,1);
      auVar277 = vinsertps_avx(auVar277,auVar190,0x9c);
      auVar84 = vshufpd_avx(auVar213,auVar213,1);
      auVar84 = vinsertps_avx(auVar84,auVar148,0x9c);
      auVar277 = vblendvps_avx(auVar84,auVar277,auVar133);
      auVar84 = vmovshdup_avx(auVar277);
      auVar277 = vmaxss_avx(auVar84,auVar277);
      fVar83 = auVar67._0_4_;
      auVar84 = vmovshdup_avx(auVar67);
      fVar166 = auVar277._0_4_;
      fVar164 = auVar66._0_4_;
      _local_418 = auVar14;
      if ((0.0001 <= fVar83) || (fVar166 <= -0.0001)) {
        auVar213 = vcmpps_avx(auVar84,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar114 = vcmpps_avx(auVar67,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar213 = vorps_avx(auVar114,auVar213);
        if ((-0.0001 < fVar164 & auVar213[0]) != 0) goto LAB_016d466e;
        auVar213 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar277,5);
        auVar114 = vcmpps_avx(auVar84,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar213 = vorps_avx(auVar114,auVar213);
        if ((auVar213 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_016d466e;
LAB_016d529b:
        bVar45 = true;
      }
      else {
LAB_016d466e:
        auVar114 = vcmpps_avx(auVar67,_DAT_01feba10,1);
        auVar133 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar213 = vcmpss_avx(auVar66,ZEXT816(0) << 0x20,1);
        auVar155._8_4_ = 0x3f800000;
        auVar155._0_8_ = &DAT_3f8000003f800000;
        auVar155._12_4_ = 0x3f800000;
        auVar212._8_4_ = 0xbf800000;
        auVar212._0_8_ = 0xbf800000bf800000;
        auVar212._12_4_ = 0xbf800000;
        auVar213 = vblendvps_avx(auVar155,auVar212,auVar213);
        auVar114 = vblendvps_avx(auVar155,auVar212,auVar114);
        fVar65 = auVar114._0_4_;
        fVar145 = auVar213._0_4_;
        auVar213 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar127 = ZEXT816(0) << 0x20;
        if ((fVar65 == fVar145) && (!NAN(fVar65) && !NAN(fVar145))) {
          auVar213 = SUB6416(ZEXT464(0x7f800000),0);
        }
        if ((fVar65 == fVar145) && (!NAN(fVar65) && !NAN(fVar145))) {
          auVar133 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar114 = vmovshdup_avx(auVar114);
        fVar184 = auVar114._0_4_;
        if ((fVar65 != fVar184) || (NAN(fVar65) || NAN(fVar184))) {
          fVar65 = auVar84._0_4_;
          if ((fVar65 != fVar83) || (NAN(fVar65) || NAN(fVar83))) {
            auVar105._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
            auVar105._8_4_ = auVar67._8_4_ ^ 0x80000000;
            auVar105._12_4_ = auVar67._12_4_ ^ 0x80000000;
            auVar134._0_4_ = -fVar83 / (fVar65 - fVar83);
            auVar134._4_12_ = auVar105._4_12_;
            auVar84 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar134._0_4_)),auVar127,auVar134);
            auVar67 = auVar84;
          }
          else {
            auVar84 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar83 == 0.0) && (auVar84 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar83))) {
              auVar84 = ZEXT816(0);
            }
            auVar67 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar83 == 0.0) && (auVar67 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar83))) {
              auVar67 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar213 = vminss_avx(auVar213,auVar84);
          auVar133 = vmaxss_avx(auVar67,auVar133);
        }
        auVar277 = vcmpss_avx(auVar277,auVar127,1);
        auVar135._8_4_ = 0x3f800000;
        auVar135._0_8_ = &DAT_3f8000003f800000;
        auVar135._12_4_ = 0x3f800000;
        auVar156._8_4_ = 0xbf800000;
        auVar156._0_8_ = 0xbf800000bf800000;
        auVar156._12_4_ = 0xbf800000;
        auVar277 = vblendvps_avx(auVar135,auVar156,auVar277);
        fVar83 = auVar277._0_4_;
        auVar277 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar145 != fVar83) || (NAN(fVar145) || NAN(fVar83))) {
          if ((fVar166 != fVar164) || (NAN(fVar166) || NAN(fVar164))) {
            auVar106._0_8_ = auVar66._0_8_ ^ 0x8000000080000000;
            auVar106._8_4_ = auVar66._8_4_ ^ 0x80000000;
            auVar106._12_4_ = auVar66._12_4_ ^ 0x80000000;
            auVar136._0_4_ = -fVar164 / (fVar166 - fVar164);
            auVar136._4_12_ = auVar106._4_12_;
            auVar84 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar136._0_4_)),auVar127,auVar136);
            auVar67 = auVar84;
          }
          else {
            auVar84 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar164 == 0.0) && (auVar84 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar164))) {
              auVar84 = ZEXT816(0);
            }
            auVar67 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar164 == 0.0) && (auVar67 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar164))) {
              auVar67 = auVar277;
            }
          }
          auVar213 = vminss_avx(auVar213,auVar84);
          auVar133 = vmaxss_avx(auVar67,auVar133);
        }
        if ((fVar184 != fVar83) || (NAN(fVar184) || NAN(fVar83))) {
          auVar213 = vminss_avx(auVar213,auVar277);
          auVar133 = vmaxss_avx(auVar277,auVar133);
        }
        auVar84 = vmaxss_avx(auVar127,auVar213);
        auVar67 = vminss_avx(auVar133,auVar277);
        bVar45 = true;
        if (auVar84._0_4_ <= auVar67._0_4_) {
          auVar84 = vmaxss_avx(auVar127,ZEXT416((uint)(auVar84._0_4_ + -0.1)));
          auVar277 = vminss_avx(ZEXT416((uint)(auVar67._0_4_ + 0.1)),auVar277);
          auVar90._0_8_ = auVar128._0_8_;
          auVar90._8_8_ = auVar90._0_8_;
          auVar214._8_8_ = local_218._0_8_;
          auVar214._0_8_ = local_218._0_8_;
          auVar227._8_8_ = auVar147._0_8_;
          auVar227._0_8_ = auVar147._0_8_;
          auVar67 = vshufpd_avx(local_218._0_16_,local_218._0_16_,3);
          auVar213 = vshufpd_avx(auVar147,auVar147,3);
          auVar114 = vshufps_avx(auVar84,auVar277,0);
          auVar118._8_4_ = 0x3f800000;
          auVar118._0_8_ = &DAT_3f8000003f800000;
          auVar118._12_4_ = 0x3f800000;
          auVar128 = vsubps_avx(auVar118,auVar114);
          local_418._0_4_ = auVar10._0_4_;
          local_418._4_4_ = auVar10._4_4_;
          fStack_410 = auVar10._8_4_;
          fStack_40c = auVar10._12_4_;
          fVar164 = auVar114._0_4_;
          auVar119._0_4_ = fVar164 * (float)local_418._0_4_;
          fVar166 = auVar114._4_4_;
          auVar119._4_4_ = fVar166 * (float)local_418._4_4_;
          fVar83 = auVar114._8_4_;
          auVar119._8_4_ = fVar83 * fStack_410;
          fVar65 = auVar114._12_4_;
          auVar119._12_4_ = fVar65 * fStack_40c;
          auVar137._0_4_ = auVar67._0_4_ * fVar164;
          auVar137._4_4_ = auVar67._4_4_ * fVar166;
          auVar137._8_4_ = auVar67._8_4_ * fVar83;
          auVar137._12_4_ = auVar67._12_4_ * fVar65;
          auVar157._0_4_ = auVar213._0_4_ * fVar164;
          auVar157._4_4_ = auVar213._4_4_ * fVar166;
          auVar157._8_4_ = auVar213._8_4_ * fVar83;
          auVar157._12_4_ = auVar213._12_4_ * fVar65;
          local_3f8._0_4_ = auVar11._0_4_;
          local_3f8._4_4_ = auVar11._4_4_;
          uStack_3f0._0_4_ = auVar11._8_4_;
          uStack_3f0._4_4_ = auVar11._12_4_;
          auVar178._0_4_ = fVar164 * (float)local_3f8._0_4_;
          auVar178._4_4_ = fVar166 * (float)local_3f8._4_4_;
          auVar178._8_4_ = fVar83 * (float)uStack_3f0;
          auVar178._12_4_ = fVar65 * uStack_3f0._4_4_;
          auVar67 = vfmadd231ps_fma(auVar119,auVar128,auVar90);
          auVar213 = vfmadd231ps_fma(auVar137,auVar128,auVar214);
          auVar114 = vfmadd231ps_fma(auVar157,auVar128,auVar227);
          auVar128 = vfmadd231ps_fma(auVar178,auVar128,ZEXT816(0));
          auVar10 = vmovshdup_avx(local_4b8);
          auVar133 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * auVar84._0_4_)),local_4b8,
                                     ZEXT416((uint)(1.0 - auVar84._0_4_)));
          auVar127 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * auVar277._0_4_)),local_4b8,
                                     ZEXT416((uint)(1.0 - auVar277._0_4_)));
          fVar164 = 1.0 / fVar144;
          auVar277 = vsubps_avx(auVar213,auVar67);
          auVar195._0_4_ = auVar277._0_4_ * 3.0;
          auVar195._4_4_ = auVar277._4_4_ * 3.0;
          auVar195._8_4_ = auVar277._8_4_ * 3.0;
          auVar195._12_4_ = auVar277._12_4_ * 3.0;
          auVar277 = vsubps_avx(auVar114,auVar213);
          auVar215._0_4_ = auVar277._0_4_ * 3.0;
          auVar215._4_4_ = auVar277._4_4_ * 3.0;
          auVar215._8_4_ = auVar277._8_4_ * 3.0;
          auVar215._12_4_ = auVar277._12_4_ * 3.0;
          auVar277 = vsubps_avx(auVar128,auVar114);
          auVar228._0_4_ = auVar277._0_4_ * 3.0;
          auVar228._4_4_ = auVar277._4_4_ * 3.0;
          auVar228._8_4_ = auVar277._8_4_ * 3.0;
          auVar228._12_4_ = auVar277._12_4_ * 3.0;
          auVar10 = vminps_avx(auVar215,auVar228);
          auVar277 = vmaxps_avx(auVar215,auVar228);
          auVar10 = vminps_avx(auVar195,auVar10);
          auVar277 = vmaxps_avx(auVar195,auVar277);
          auVar11 = vshufpd_avx(auVar10,auVar10,3);
          auVar84 = vshufpd_avx(auVar277,auVar277,3);
          auVar10 = vminps_avx(auVar10,auVar11);
          auVar277 = vmaxps_avx(auVar277,auVar84);
          auVar216._0_4_ = auVar10._0_4_ * fVar164;
          auVar216._4_4_ = auVar10._4_4_ * fVar164;
          auVar216._8_4_ = auVar10._8_4_ * fVar164;
          auVar216._12_4_ = auVar10._12_4_ * fVar164;
          auVar196._0_4_ = fVar164 * auVar277._0_4_;
          auVar196._4_4_ = fVar164 * auVar277._4_4_;
          auVar196._8_4_ = fVar164 * auVar277._8_4_;
          auVar196._12_4_ = fVar164 * auVar277._12_4_;
          fVar164 = 1.0 / (auVar127._0_4_ - auVar133._0_4_);
          auVar277 = vshufpd_avx(auVar67,auVar67,3);
          auVar10 = vshufpd_avx(auVar213,auVar213,3);
          auVar11 = vshufpd_avx(auVar114,auVar114,3);
          auVar84 = vshufpd_avx(auVar128,auVar128,3);
          auVar277 = vsubps_avx(auVar277,auVar67);
          auVar67 = vsubps_avx(auVar10,auVar213);
          auVar213 = vsubps_avx(auVar11,auVar114);
          auVar84 = vsubps_avx(auVar84,auVar128);
          auVar10 = vminps_avx(auVar277,auVar67);
          auVar277 = vmaxps_avx(auVar277,auVar67);
          auVar11 = vminps_avx(auVar213,auVar84);
          auVar11 = vminps_avx(auVar10,auVar11);
          auVar10 = vmaxps_avx(auVar213,auVar84);
          auVar277 = vmaxps_avx(auVar277,auVar10);
          auVar248._0_4_ = fVar164 * auVar11._0_4_;
          auVar248._4_4_ = fVar164 * auVar11._4_4_;
          auVar248._8_4_ = fVar164 * auVar11._8_4_;
          auVar248._12_4_ = fVar164 * auVar11._12_4_;
          auVar239._0_4_ = fVar164 * auVar277._0_4_;
          auVar239._4_4_ = fVar164 * auVar277._4_4_;
          auVar239._8_4_ = fVar164 * auVar277._8_4_;
          auVar239._12_4_ = fVar164 * auVar277._12_4_;
          auVar11 = vinsertps_avx(auVar13,auVar133,0x10);
          auVar84 = vinsertps_avx(auVar9,auVar127,0x10);
          auVar80._0_4_ = (auVar11._0_4_ + auVar84._0_4_) * 0.5;
          auVar80._4_4_ = (auVar11._4_4_ + auVar84._4_4_) * 0.5;
          auVar80._8_4_ = (auVar11._8_4_ + auVar84._8_4_) * 0.5;
          auVar80._12_4_ = (auVar11._12_4_ + auVar84._12_4_) * 0.5;
          auVar120._4_4_ = auVar80._0_4_;
          auVar120._0_4_ = auVar80._0_4_;
          auVar120._8_4_ = auVar80._0_4_;
          auVar120._12_4_ = auVar80._0_4_;
          auVar9 = vfmadd213ps_fma(local_228,auVar120,local_488);
          auVar277 = vfmadd213ps_fma(local_238,auVar120,local_498);
          auVar10 = vfmadd213ps_fma(local_248,auVar120,local_348);
          auVar13 = vsubps_avx(auVar277,auVar9);
          auVar9 = vfmadd213ps_fma(auVar13,auVar120,auVar9);
          auVar13 = vsubps_avx(auVar10,auVar277);
          auVar13 = vfmadd213ps_fma(auVar13,auVar120,auVar277);
          auVar13 = vsubps_avx(auVar13,auVar9);
          auVar9 = vfmadd231ps_fma(auVar9,auVar13,auVar120);
          auVar121._0_8_ = CONCAT44(auVar13._4_4_ * 3.0,auVar13._0_4_ * 3.0);
          auVar121._8_4_ = auVar13._8_4_ * 3.0;
          auVar121._12_4_ = auVar13._12_4_ * 3.0;
          auVar229._8_8_ = auVar9._0_8_;
          auVar229._0_8_ = auVar9._0_8_;
          auVar13 = vshufpd_avx(auVar9,auVar9,3);
          auVar9 = vshufps_avx(auVar80,auVar80,0x55);
          auVar67 = vsubps_avx(auVar13,auVar229);
          auVar114 = vfmadd231ps_fma(auVar229,auVar9,auVar67);
          auVar265._8_8_ = auVar121._0_8_;
          auVar265._0_8_ = auVar121._0_8_;
          auVar13 = vshufpd_avx(auVar121,auVar121,3);
          auVar13 = vsubps_avx(auVar13,auVar265);
          auVar213 = vfmadd213ps_fma(auVar13,auVar9,auVar265);
          auVar9 = vmovshdup_avx(auVar213);
          auVar266._0_8_ = auVar9._0_8_ ^ 0x8000000080000000;
          auVar266._8_4_ = auVar9._8_4_ ^ 0x80000000;
          auVar266._12_4_ = auVar9._12_4_ ^ 0x80000000;
          auVar277 = vmovshdup_avx(auVar67);
          auVar13 = vunpcklps_avx(auVar277,auVar266);
          auVar10 = vshufps_avx(auVar13,auVar266,4);
          auVar286._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
          auVar286._8_4_ = auVar67._8_4_ ^ 0x80000000;
          auVar286._12_4_ = auVar67._12_4_ ^ 0x80000000;
          auVar13 = vmovlhps_avx(auVar286,auVar213);
          auVar13 = vshufps_avx(auVar13,auVar213,8);
          auVar9 = vfmsub231ss_fma(ZEXT416((uint)(auVar9._0_4_ * auVar67._0_4_)),auVar277,auVar213);
          auVar138._0_4_ = auVar9._0_4_;
          auVar138._4_4_ = auVar138._0_4_;
          auVar138._8_4_ = auVar138._0_4_;
          auVar138._12_4_ = auVar138._0_4_;
          auVar9 = vdivps_avx(auVar10,auVar138);
          auVar277 = vdivps_avx(auVar13,auVar138);
          fVar83 = auVar114._0_4_;
          fVar164 = auVar9._0_4_;
          auVar13 = vshufps_avx(auVar114,auVar114,0x55);
          fVar166 = auVar277._0_4_;
          local_3f8._4_4_ = fVar83 * auVar9._4_4_ + auVar13._4_4_ * auVar277._4_4_;
          local_3f8._0_4_ = fVar83 * fVar164 + auVar13._0_4_ * fVar166;
          uStack_3f0._0_4_ = fVar83 * auVar9._8_4_ + auVar13._8_4_ * auVar277._8_4_;
          uStack_3f0._4_4_ = fVar83 * auVar9._12_4_ + auVar13._12_4_ * auVar277._12_4_;
          auVar67 = vmovshdup_avx(auVar9);
          auVar13 = vinsertps_avx(auVar216,auVar248,0x1c);
          auVar278._0_4_ = auVar67._0_4_ * auVar13._0_4_;
          auVar278._4_4_ = auVar67._4_4_ * auVar13._4_4_;
          auVar278._8_4_ = auVar67._8_4_ * auVar13._8_4_;
          auVar278._12_4_ = auVar67._12_4_ * auVar13._12_4_;
          auVar10 = vinsertps_avx(auVar196,auVar239,0x1c);
          auVar256._0_4_ = auVar67._0_4_ * auVar10._0_4_;
          auVar256._4_4_ = auVar67._4_4_ * auVar10._4_4_;
          auVar256._8_4_ = auVar67._8_4_ * auVar10._8_4_;
          auVar256._12_4_ = auVar67._12_4_ * auVar10._12_4_;
          auVar128 = vminps_avx(auVar278,auVar256);
          auVar114 = vmaxps_avx(auVar256,auVar278);
          auVar67 = vinsertps_avx(auVar248,auVar216,0x4c);
          auVar66 = vmovshdup_avx(auVar277);
          auVar213 = vinsertps_avx(auVar239,auVar196,0x4c);
          auVar240._0_4_ = auVar66._0_4_ * auVar67._0_4_;
          auVar240._4_4_ = auVar66._4_4_ * auVar67._4_4_;
          auVar240._8_4_ = auVar66._8_4_ * auVar67._8_4_;
          auVar240._12_4_ = auVar66._12_4_ * auVar67._12_4_;
          auVar249._0_4_ = auVar66._0_4_ * auVar213._0_4_;
          auVar249._4_4_ = auVar66._4_4_ * auVar213._4_4_;
          auVar249._8_4_ = auVar66._8_4_ * auVar213._8_4_;
          auVar249._12_4_ = auVar66._12_4_ * auVar213._12_4_;
          auVar66 = vminps_avx(auVar240,auVar249);
          auVar91._0_4_ = auVar66._0_4_ + auVar128._0_4_;
          auVar91._4_4_ = auVar66._4_4_ + auVar128._4_4_;
          auVar91._8_4_ = auVar66._8_4_ + auVar128._8_4_;
          auVar91._12_4_ = auVar66._12_4_ + auVar128._12_4_;
          auVar128 = vmaxps_avx(auVar249,auVar240);
          auVar241._0_4_ = auVar114._0_4_ + auVar128._0_4_;
          auVar241._4_4_ = auVar114._4_4_ + auVar128._4_4_;
          auVar241._8_4_ = auVar114._8_4_ + auVar128._8_4_;
          auVar241._12_4_ = auVar114._12_4_ + auVar128._12_4_;
          auVar250._8_8_ = 0x3f80000000000000;
          auVar250._0_8_ = 0x3f80000000000000;
          auVar114 = vsubps_avx(auVar250,auVar241);
          auVar128 = vsubps_avx(auVar250,auVar91);
          auVar66 = vsubps_avx(auVar11,auVar80);
          auVar267._0_4_ = fVar164 * auVar13._0_4_;
          auVar267._4_4_ = fVar164 * auVar13._4_4_;
          auVar267._8_4_ = fVar164 * auVar13._8_4_;
          auVar267._12_4_ = fVar164 * auVar13._12_4_;
          auVar257._0_4_ = fVar164 * auVar10._0_4_;
          auVar257._4_4_ = fVar164 * auVar10._4_4_;
          auVar257._8_4_ = fVar164 * auVar10._8_4_;
          auVar257._12_4_ = fVar164 * auVar10._12_4_;
          auVar10 = vminps_avx(auVar267,auVar257);
          auVar13 = vmaxps_avx(auVar257,auVar267);
          auVar217._0_4_ = fVar166 * auVar67._0_4_;
          auVar217._4_4_ = fVar166 * auVar67._4_4_;
          auVar217._8_4_ = fVar166 * auVar67._8_4_;
          auVar217._12_4_ = fVar166 * auVar67._12_4_;
          auVar197._0_4_ = fVar166 * auVar213._0_4_;
          auVar197._4_4_ = fVar166 * auVar213._4_4_;
          auVar197._8_4_ = fVar166 * auVar213._8_4_;
          auVar197._12_4_ = fVar166 * auVar213._12_4_;
          auVar67 = vminps_avx(auVar217,auVar197);
          auVar268._0_4_ = auVar10._0_4_ + auVar67._0_4_;
          auVar268._4_4_ = auVar10._4_4_ + auVar67._4_4_;
          auVar268._8_4_ = auVar10._8_4_ + auVar67._8_4_;
          auVar268._12_4_ = auVar10._12_4_ + auVar67._12_4_;
          auVar67 = vsubps_avx(auVar84,auVar80);
          auVar10 = vmaxps_avx(auVar197,auVar217);
          fVar83 = auVar66._0_4_;
          auVar218._0_4_ = fVar83 * auVar114._0_4_;
          fVar65 = auVar66._4_4_;
          auVar218._4_4_ = fVar65 * auVar114._4_4_;
          fVar145 = auVar66._8_4_;
          auVar218._8_4_ = fVar145 * auVar114._8_4_;
          fVar184 = auVar66._12_4_;
          auVar218._12_4_ = fVar184 * auVar114._12_4_;
          auVar198._0_4_ = auVar13._0_4_ + auVar10._0_4_;
          auVar198._4_4_ = auVar13._4_4_ + auVar10._4_4_;
          auVar198._8_4_ = auVar13._8_4_ + auVar10._8_4_;
          auVar198._12_4_ = auVar13._12_4_ + auVar10._12_4_;
          auVar258._8_8_ = 0x3f800000;
          auVar258._0_8_ = 0x3f800000;
          auVar13 = vsubps_avx(auVar258,auVar198);
          auVar10 = vsubps_avx(auVar258,auVar268);
          auVar269._0_4_ = fVar83 * auVar128._0_4_;
          auVar269._4_4_ = fVar65 * auVar128._4_4_;
          auVar269._8_4_ = fVar145 * auVar128._8_4_;
          auVar269._12_4_ = fVar184 * auVar128._12_4_;
          fVar167 = auVar67._0_4_;
          auVar242._0_4_ = fVar167 * auVar114._0_4_;
          fVar168 = auVar67._4_4_;
          auVar242._4_4_ = fVar168 * auVar114._4_4_;
          fVar143 = auVar67._8_4_;
          auVar242._8_4_ = fVar143 * auVar114._8_4_;
          fVar161 = auVar67._12_4_;
          auVar242._12_4_ = fVar161 * auVar114._12_4_;
          auVar92._0_4_ = fVar167 * auVar128._0_4_;
          auVar92._4_4_ = fVar168 * auVar128._4_4_;
          auVar92._8_4_ = fVar143 * auVar128._8_4_;
          auVar92._12_4_ = fVar161 * auVar128._12_4_;
          auVar287._0_4_ = fVar83 * auVar13._0_4_;
          auVar287._4_4_ = fVar65 * auVar13._4_4_;
          auVar287._8_4_ = fVar145 * auVar13._8_4_;
          auVar287._12_4_ = fVar184 * auVar13._12_4_;
          auVar251._0_4_ = fVar83 * auVar10._0_4_;
          auVar251._4_4_ = fVar65 * auVar10._4_4_;
          auVar251._8_4_ = fVar145 * auVar10._8_4_;
          auVar251._12_4_ = fVar184 * auVar10._12_4_;
          auVar199._0_4_ = fVar167 * auVar13._0_4_;
          auVar199._4_4_ = fVar168 * auVar13._4_4_;
          auVar199._8_4_ = fVar143 * auVar13._8_4_;
          auVar199._12_4_ = fVar161 * auVar13._12_4_;
          auVar259._0_4_ = fVar167 * auVar10._0_4_;
          auVar259._4_4_ = fVar168 * auVar10._4_4_;
          auVar259._8_4_ = fVar143 * auVar10._8_4_;
          auVar259._12_4_ = fVar161 * auVar10._12_4_;
          auVar13 = vminps_avx(auVar287,auVar251);
          auVar10 = vminps_avx(auVar199,auVar259);
          auVar13 = vminps_avx(auVar13,auVar10);
          auVar10 = vmaxps_avx(auVar251,auVar287);
          auVar67 = vminps_avx(auVar218,auVar269);
          auVar213 = vminps_avx(auVar242,auVar92);
          auVar67 = vminps_avx(auVar67,auVar213);
          auVar13 = vhaddps_avx(auVar13,auVar67);
          auVar67 = vmaxps_avx(auVar259,auVar199);
          auVar10 = vmaxps_avx(auVar67,auVar10);
          auVar67 = vmaxps_avx(auVar269,auVar218);
          auVar213 = vmaxps_avx(auVar92,auVar242);
          auVar67 = vmaxps_avx(auVar213,auVar67);
          auVar10 = vhaddps_avx(auVar10,auVar67);
          auVar67 = vshufps_avx(auVar80,auVar80,0x54);
          auVar67 = vsubps_avx(auVar67,_local_3f8);
          auVar13 = vshufps_avx(auVar13,auVar13,0xe8);
          auVar10 = vshufps_avx(auVar10,auVar10,0xe8);
          auVar219._0_4_ = auVar67._0_4_ + auVar13._0_4_;
          auVar219._4_4_ = auVar67._4_4_ + auVar13._4_4_;
          auVar219._8_4_ = auVar67._8_4_ + auVar13._8_4_;
          auVar219._12_4_ = auVar67._12_4_ + auVar13._12_4_;
          auVar200._0_4_ = auVar67._0_4_ + auVar10._0_4_;
          auVar200._4_4_ = auVar67._4_4_ + auVar10._4_4_;
          auVar200._8_4_ = auVar67._8_4_ + auVar10._8_4_;
          auVar200._12_4_ = auVar67._12_4_ + auVar10._12_4_;
          auVar13 = vmaxps_avx(auVar11,auVar219);
          auVar10 = vminps_avx(auVar200,auVar84);
          auVar13 = vcmpps_avx(auVar10,auVar13,1);
          auVar13 = vshufps_avx(auVar13,auVar13,0x50);
          local_4b8 = vinsertps_avx(auVar133,ZEXT416((uint)auVar127._0_4_),0x10);
          if ((auVar13 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar13[0xf] < '\0') goto LAB_016d529b;
          bVar59 = 0;
          if ((fVar162 < auVar219._0_4_) && (bVar59 = 0, auVar200._0_4_ < auVar84._0_4_)) {
            auVar10 = vmovshdup_avx(auVar219);
            auVar13 = vcmpps_avx(auVar200,auVar84,1);
            bVar59 = auVar13[4] & auVar133._0_4_ < auVar10._0_4_;
          }
          if (((3 < (uint)uVar56 || fVar144 < 0.001) | bVar59) == 1) {
            lVar58 = 200;
            do {
              fVar65 = auVar67._0_4_;
              fVar83 = 1.0 - fVar65;
              fVar144 = fVar83 * fVar83 * fVar83;
              fVar162 = fVar65 * 3.0 * fVar83 * fVar83;
              fVar83 = fVar83 * fVar65 * fVar65 * 3.0;
              auVar158._4_4_ = fVar144;
              auVar158._0_4_ = fVar144;
              auVar158._8_4_ = fVar144;
              auVar158._12_4_ = fVar144;
              auVar107._4_4_ = fVar162;
              auVar107._0_4_ = fVar162;
              auVar107._8_4_ = fVar162;
              auVar107._12_4_ = fVar162;
              auVar93._4_4_ = fVar83;
              auVar93._0_4_ = fVar83;
              auVar93._8_4_ = fVar83;
              auVar93._12_4_ = fVar83;
              fVar65 = fVar65 * fVar65 * fVar65;
              auVar179._0_4_ = (float)local_258._0_4_ * fVar65;
              auVar179._4_4_ = (float)local_258._4_4_ * fVar65;
              auVar179._8_4_ = fStack_250 * fVar65;
              auVar179._12_4_ = fStack_24c * fVar65;
              auVar13 = vfmadd231ps_fma(auVar179,local_348,auVar93);
              auVar13 = vfmadd231ps_fma(auVar13,local_498,auVar107);
              auVar13 = vfmadd231ps_fma(auVar13,local_488,auVar158);
              auVar94._8_8_ = auVar13._0_8_;
              auVar94._0_8_ = auVar13._0_8_;
              auVar13 = vshufpd_avx(auVar13,auVar13,3);
              auVar10 = vshufps_avx(auVar67,auVar67,0x55);
              auVar13 = vsubps_avx(auVar13,auVar94);
              auVar10 = vfmadd213ps_fma(auVar13,auVar10,auVar94);
              fVar144 = auVar10._0_4_;
              auVar13 = vshufps_avx(auVar10,auVar10,0x55);
              auVar95._0_4_ = fVar164 * fVar144 + fVar166 * auVar13._0_4_;
              auVar95._4_4_ = auVar9._4_4_ * fVar144 + auVar277._4_4_ * auVar13._4_4_;
              auVar95._8_4_ = auVar9._8_4_ * fVar144 + auVar277._8_4_ * auVar13._8_4_;
              auVar95._12_4_ = auVar9._12_4_ * fVar144 + auVar277._12_4_ * auVar13._12_4_;
              auVar67 = vsubps_avx(auVar67,auVar95);
              auVar13 = vandps_avx(local_358,auVar10);
              auVar10 = vshufps_avx(auVar13,auVar13,0xf5);
              auVar13 = vmaxss_avx(auVar10,auVar13);
              if (auVar13._0_4_ < (float)local_438._0_4_) {
                fVar144 = auVar67._0_4_;
                if ((0.0 <= fVar144) && (fVar144 <= 1.0)) {
                  auVar13 = vmovshdup_avx(auVar67);
                  fVar162 = auVar13._0_4_;
                  if ((0.0 <= fVar162) && (fVar162 <= 1.0)) {
                    auVar13 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                            ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c)
                    ;
                    auVar114 = vinsertps_avx(auVar13,ZEXT416((uint)(pre->ray_space).vz.field_0.m128
                                                                   [2]),0x28);
                    aVar2 = (ray->org).field_0;
                    auVar13 = vsubps_avx(local_368,(undefined1  [16])aVar2);
                    auVar13 = vdpps_avx(auVar13,auVar114,0x7f);
                    auVar9 = vsubps_avx(local_398,(undefined1  [16])aVar2);
                    auVar9 = vdpps_avx(auVar9,auVar114,0x7f);
                    auVar277 = vsubps_avx(local_3a8,(undefined1  [16])aVar2);
                    auVar277 = vdpps_avx(auVar277,auVar114,0x7f);
                    auVar10 = vsubps_avx(local_388,(undefined1  [16])aVar2);
                    auVar10 = vdpps_avx(auVar10,auVar114,0x7f);
                    auVar11 = vsubps_avx(_local_378,(undefined1  [16])aVar2);
                    auVar11 = vdpps_avx(auVar11,auVar114,0x7f);
                    auVar84 = vsubps_avx(_local_3b8,(undefined1  [16])aVar2);
                    auVar84 = vdpps_avx(auVar84,auVar114,0x7f);
                    auVar213 = vsubps_avx(_local_3c8,(undefined1  [16])aVar2);
                    auVar213 = vdpps_avx(auVar213,auVar114,0x7f);
                    auVar50._4_4_ = fStack_3d4;
                    auVar50._0_4_ = local_3d8;
                    auVar50._8_4_ = fStack_3d0;
                    auVar50._12_4_ = fStack_3cc;
                    auVar128 = vsubps_avx(auVar50,(undefined1  [16])aVar2);
                    auVar114 = vdpps_avx(auVar128,auVar114,0x7f);
                    fVar164 = 1.0 - fVar162;
                    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * fVar162)),
                                              ZEXT416((uint)fVar164),auVar13);
                    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(auVar84._0_4_ * fVar162)),
                                             ZEXT416((uint)fVar164),auVar9);
                    auVar277 = vfmadd231ss_fma(ZEXT416((uint)(auVar213._0_4_ * fVar162)),
                                               ZEXT416((uint)fVar164),auVar277);
                    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar162 * auVar114._0_4_)),
                                              ZEXT416((uint)fVar164),auVar10);
                    fVar83 = 1.0 - fVar144;
                    fVar162 = fVar83 * fVar144 * fVar144 * 3.0;
                    fVar145 = fVar144 * fVar144 * fVar144;
                    auVar277 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * fVar145)),
                                               ZEXT416((uint)fVar162),auVar277);
                    fVar164 = fVar144 * 3.0 * fVar83 * fVar83;
                    auVar9 = vfmadd231ss_fma(auVar277,ZEXT416((uint)fVar164),auVar9);
                    fVar166 = fVar83 * fVar83 * fVar83;
                    auVar13 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar166),auVar13);
                    fVar65 = auVar13._0_4_;
                    if ((ray->org).field_0.m128[3] <= fVar65) {
                      local_3f8._0_4_ = ray->tfar;
                      if (fVar65 <= ray->tfar) {
                        pGVar5 = (context->scene->geometries).items[local_420].ptr;
                        if ((pGVar5->mask & ray->mask) == 0) {
                          bVar59 = 0;
                        }
                        else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                (bVar59 = 1, pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar13 = vshufps_avx(auVar67,auVar67,0x55);
                          auVar220._8_4_ = 0x3f800000;
                          auVar220._0_8_ = &DAT_3f8000003f800000;
                          auVar220._12_4_ = 0x3f800000;
                          auVar9 = vsubps_avx(auVar220,auVar13);
                          fVar184 = auVar13._0_4_;
                          auVar230._0_4_ = fVar184 * (float)local_378._0_4_;
                          fVar167 = auVar13._4_4_;
                          auVar230._4_4_ = fVar167 * (float)local_378._4_4_;
                          fVar168 = auVar13._8_4_;
                          auVar230._8_4_ = fVar168 * fStack_370;
                          fVar143 = auVar13._12_4_;
                          auVar230._12_4_ = fVar143 * fStack_36c;
                          auVar243._0_4_ = fVar184 * (float)local_3b8._0_4_;
                          auVar243._4_4_ = fVar167 * (float)local_3b8._4_4_;
                          auVar243._8_4_ = fVar168 * fStack_3b0;
                          auVar243._12_4_ = fVar143 * fStack_3ac;
                          auVar252._0_4_ = fVar184 * (float)local_3c8._0_4_;
                          auVar252._4_4_ = fVar167 * (float)local_3c8._4_4_;
                          auVar252._8_4_ = fVar168 * fStack_3c0;
                          auVar252._12_4_ = fVar143 * fStack_3bc;
                          auVar201._0_4_ = fVar184 * local_3d8;
                          auVar201._4_4_ = fVar167 * fStack_3d4;
                          auVar201._8_4_ = fVar168 * fStack_3d0;
                          auVar201._12_4_ = fVar143 * fStack_3cc;
                          auVar13 = vfmadd231ps_fma(auVar230,auVar9,local_368);
                          auVar277 = vfmadd231ps_fma(auVar243,auVar9,local_398);
                          auVar10 = vfmadd231ps_fma(auVar252,auVar9,local_3a8);
                          auVar11 = vfmadd231ps_fma(auVar201,auVar9,local_388);
                          auVar13 = vsubps_avx(auVar277,auVar13);
                          auVar9 = vsubps_avx(auVar10,auVar277);
                          auVar277 = vsubps_avx(auVar11,auVar10);
                          auVar253._0_4_ = fVar144 * auVar9._0_4_;
                          auVar253._4_4_ = fVar144 * auVar9._4_4_;
                          auVar253._8_4_ = fVar144 * auVar9._8_4_;
                          auVar253._12_4_ = fVar144 * auVar9._12_4_;
                          auVar180._4_4_ = fVar83;
                          auVar180._0_4_ = fVar83;
                          auVar180._8_4_ = fVar83;
                          auVar180._12_4_ = fVar83;
                          auVar13 = vfmadd231ps_fma(auVar253,auVar180,auVar13);
                          auVar202._0_4_ = fVar144 * auVar277._0_4_;
                          auVar202._4_4_ = fVar144 * auVar277._4_4_;
                          auVar202._8_4_ = fVar144 * auVar277._8_4_;
                          auVar202._12_4_ = fVar144 * auVar277._12_4_;
                          auVar9 = vfmadd231ps_fma(auVar202,auVar180,auVar9);
                          auVar203._0_4_ = fVar144 * auVar9._0_4_;
                          auVar203._4_4_ = fVar144 * auVar9._4_4_;
                          auVar203._8_4_ = fVar144 * auVar9._8_4_;
                          auVar203._12_4_ = fVar144 * auVar9._12_4_;
                          auVar9 = vfmadd231ps_fma(auVar203,auVar180,auVar13);
                          auVar159._0_4_ = fVar145 * (float)local_2b8._0_4_;
                          auVar159._4_4_ = fVar145 * (float)local_2b8._4_4_;
                          auVar159._8_4_ = fVar145 * fStack_2b0;
                          auVar159._12_4_ = fVar145 * fStack_2ac;
                          auVar108._4_4_ = fVar162;
                          auVar108._0_4_ = fVar162;
                          auVar108._8_4_ = fVar162;
                          auVar108._12_4_ = fVar162;
                          auVar13 = vfmadd132ps_fma(auVar108,auVar159,local_2a8);
                          auVar139._4_4_ = fVar164;
                          auVar139._0_4_ = fVar164;
                          auVar139._8_4_ = fVar164;
                          auVar139._12_4_ = fVar164;
                          auVar13 = vfmadd132ps_fma(auVar139,auVar13,local_298);
                          auVar109._0_4_ = auVar9._0_4_ * 3.0;
                          auVar109._4_4_ = auVar9._4_4_ * 3.0;
                          auVar109._8_4_ = auVar9._8_4_ * 3.0;
                          auVar109._12_4_ = auVar9._12_4_ * 3.0;
                          auVar122._4_4_ = fVar166;
                          auVar122._0_4_ = fVar166;
                          auVar122._8_4_ = fVar166;
                          auVar122._12_4_ = fVar166;
                          auVar9 = vfmadd132ps_fma(auVar122,auVar13,local_288);
                          auVar13 = vshufps_avx(auVar109,auVar109,0xc9);
                          auVar140._0_4_ = auVar9._0_4_ * auVar13._0_4_;
                          auVar140._4_4_ = auVar9._4_4_ * auVar13._4_4_;
                          auVar140._8_4_ = auVar9._8_4_ * auVar13._8_4_;
                          auVar140._12_4_ = auVar9._12_4_ * auVar13._12_4_;
                          auVar13 = vshufps_avx(auVar9,auVar9,0xc9);
                          auVar9 = vfmsub231ps_fma(auVar140,auVar109,auVar13);
                          auVar13 = vshufps_avx(auVar9,auVar9,0xe9);
                          local_2e8 = vmovlps_avx(auVar13);
                          local_2e0 = auVar9._0_4_;
                          local_2dc = vmovlps_avx(auVar67);
                          local_2d4 = (int)local_338;
                          local_2d0 = (int)local_420;
                          local_2cc = context->user->instID[0];
                          local_2c8 = context->user->instPrimID[0];
                          ray->tfar = fVar65;
                          local_49c = -1;
                          local_328.valid = &local_49c;
                          local_328.geometryUserPtr = pGVar5->userPtr;
                          local_328.context = context->user;
                          local_328.hit = (RTCHitN *)&local_2e8;
                          local_328.N = 1;
                          local_328.ray = (RTCRayN *)ray;
                          if (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_016d517b:
                            p_Var6 = context->args->filter;
                            if (p_Var6 != (RTCFilterFunctionN)0x0) {
                              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                                (*p_Var6)(&local_328);
                              }
                              if (*local_328.valid == 0) {
                                bVar59 = 0;
                                goto LAB_016d52cc;
                              }
                            }
                            bVar59 = 1;
                          }
                          else {
                            stack0xfffffffffffffbec = auVar14._4_28_;
                            local_418._0_4_ = (int)uVar62;
                            (*pGVar5->occlusionFilterN)(&local_328);
                            uVar62 = (ulong)(uint)local_418._0_4_;
                            if (*local_328.valid != 0) goto LAB_016d517b;
                            bVar59 = 0;
                          }
LAB_016d52cc:
                          if (bVar59 == 0) {
                            ray->tfar = (float)local_3f8._0_4_;
                          }
                        }
                        uVar62 = CONCAT71((int7)(uVar62 >> 8),(byte)uVar62 | bVar59);
                      }
                    }
                  }
                }
                break;
              }
              lVar58 = lVar58 + -1;
            } while (lVar58 != 0);
          }
          else {
            bVar45 = false;
          }
        }
      }
      auVar281 = ZEXT464(0x3f800000);
      auVar13 = local_458._0_16_;
    } while (bVar45);
    local_458._0_16_ = auVar13;
    local_268 = vinsertps_avx(local_458._0_16_,ZEXT416((uint)local_478),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }